

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_striped_sse41_128_8.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_stats_striped_profile_sse41_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int iVar1;
  int iVar2;
  parasail_matrix_t *ppVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  __m128i *palVar7;
  __m128i *palVar8;
  __m128i *palVar9;
  __m128i *palVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  longlong lVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  longlong lVar16;
  ulong uVar17;
  ulong uVar18;
  longlong lVar19;
  longlong lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  __m128i alVar57;
  char cVar58;
  char cVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  __m128i *ptr;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  int8_t *ptr_00;
  __m128i *palVar63;
  uint uVar64;
  int iVar65;
  int iVar66;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  byte bVar67;
  char cVar68;
  char cVar69;
  char cVar73;
  char cVar74;
  char cVar76;
  char cVar77;
  char cVar79;
  char cVar80;
  char cVar82;
  char cVar83;
  char cVar85;
  char cVar86;
  char cVar88;
  char cVar89;
  byte bVar90;
  char cVar91;
  char cVar92;
  ulong uVar70;
  byte bVar72;
  byte bVar75;
  byte bVar78;
  byte bVar81;
  byte bVar84;
  byte bVar87;
  byte bVar93;
  char cVar94;
  char cVar95;
  byte bVar97;
  byte bVar100;
  byte bVar103;
  byte bVar106;
  byte bVar109;
  byte bVar112;
  undefined1 auVar71 [16];
  char cVar98;
  char cVar99;
  char cVar101;
  char cVar102;
  char cVar104;
  char cVar105;
  char cVar107;
  char cVar108;
  char cVar110;
  char cVar111;
  char cVar113;
  char cVar114;
  byte bVar115;
  char cVar116;
  char cVar117;
  ulong uVar96;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  __m128i alVar124;
  __m128i alVar125;
  __m128i alVar126;
  __m128i alVar127;
  __m128i alVar128;
  __m128i alVar129;
  ulong local_1298;
  int local_128c;
  int local_127c;
  long local_1278;
  long local_1270;
  int local_1268;
  ulong uStack_1258;
  __m128i vHL_1;
  __m128i vHS_1;
  __m128i vHM_1;
  __m128i vH_1;
  int32_t temp;
  int32_t column_len;
  int8_t *l;
  int8_t *s;
  int8_t *m;
  int8_t *t;
  __m128i cond_max;
  __m128i cond;
  __m128i case2_1;
  __m128i case1_1;
  int8_t tmp2;
  int64_t tmp_6;
  __m128i vHp;
  __m128i case2;
  __m128i case1;
  __m128i *tmp_5;
  __m128i *tmp_4;
  __m128i *tmp_3;
  __m128i *tmp_2;
  __m128i *vPS;
  __m128i *vPM;
  __m128i *vP;
  __m128i vHL;
  __m128i vHS;
  __m128i vHM;
  __m128i vH_dag;
  __m128i vH;
  __m128i vFL;
  __m128i vFS;
  __m128i vFM;
  __m128i vF_ext;
  __m128i vF;
  __m128i vEL;
  __m128i vES;
  __m128i vEM;
  __m128i vE_ext;
  __m128i vE;
  __m128i vEF_opn;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_8_t e;
  __m128i_8_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m128i vPosMask;
  __m128i vMaxHL;
  __m128i vMaxHS;
  __m128i vMaxHM;
  __m128i vMaxH;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  char local_f4c;
  int8_t local_f4b;
  int8_t local_f4a;
  char local_f49;
  int8_t length;
  int8_t similar;
  int8_t matches;
  int8_t score;
  __m128i vOne;
  __m128i vZero;
  int8_t POS_LIMIT;
  int8_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int8_t *boundary;
  __m128i *pvEL;
  __m128i *pvES;
  __m128i *pvEM;
  __m128i *pvE;
  __m128i *pvHLLoad;
  __m128i *pvHLStore;
  __m128i *pvHSLoad;
  __m128i *pvHSStore;
  __m128i *pvHMLoad;
  __m128i *pvHMStore;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfileS;
  __m128i *vProfileM;
  __m128i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int s1_beg_local;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  byte local_dc8;
  byte bStack_dc7;
  byte bStack_dc6;
  byte bStack_dc5;
  byte bStack_dc4;
  byte bStack_dc3;
  byte bStack_dc2;
  byte bStack_dc1;
  byte bStack_dc0;
  byte bStack_dbf;
  byte bStack_dbe;
  byte bStack_dbd;
  byte bStack_dbc;
  byte bStack_dbb;
  byte bStack_dba;
  byte bStack_db9;
  undefined1 local_d38 [8];
  undefined1 local_d30 [24];
  undefined1 local_d18 [8];
  undefined1 local_d10 [56];
  undefined1 local_cd8 [8];
  undefined1 local_cd0 [24];
  undefined1 local_cb8 [8];
  undefined1 local_cb0 [1112];
  char local_858;
  char cStack_857;
  char cStack_856;
  char cStack_855;
  char cStack_854;
  char cStack_853;
  char cStack_852;
  char cStack_851;
  char cStack_850;
  char cStack_84f;
  char cStack_84e;
  char cStack_84d;
  char cStack_84c;
  char cStack_84b;
  char cStack_84a;
  char cStack_849;
  char local_838;
  char cStack_837;
  char cStack_836;
  char cStack_835;
  char cStack_834;
  char cStack_833;
  char cStack_832;
  char cStack_831;
  char cStack_830;
  char cStack_82f;
  char cStack_82e;
  char cStack_82d;
  char cStack_82c;
  char cStack_82b;
  char cStack_82a;
  char cStack_829;
  char local_818;
  char cStack_817;
  char cStack_816;
  char cStack_815;
  char cStack_814;
  char cStack_813;
  char cStack_812;
  char cStack_811;
  char cStack_810;
  char cStack_80f;
  char cStack_80e;
  char cStack_80d;
  char cStack_80c;
  char cStack_80b;
  char cStack_80a;
  char cStack_809;
  char local_7e8;
  char cStack_7e7;
  char cStack_7e6;
  char cStack_7e5;
  char cStack_7e4;
  char cStack_7e3;
  char cStack_7e2;
  char cStack_7e1;
  char cStack_7e0;
  char cStack_7df;
  char cStack_7de;
  char cStack_7dd;
  char cStack_7dc;
  char cStack_7db;
  char cStack_7da;
  char cStack_7d9;
  byte local_7d8;
  byte bStack_7d7;
  byte bStack_7d6;
  byte bStack_7d5;
  byte bStack_7d4;
  byte bStack_7d3;
  byte bStack_7d2;
  byte bStack_7d1;
  byte bStack_7d0;
  byte bStack_7cf;
  byte bStack_7ce;
  byte bStack_7cd;
  byte bStack_7cc;
  byte bStack_7cb;
  byte bStack_7ca;
  byte bStack_7c9;
  char local_7c8;
  char cStack_7c7;
  char cStack_7c6;
  char cStack_7c5;
  char cStack_7c4;
  char cStack_7c3;
  char cStack_7c2;
  char cStack_7c1;
  char cStack_7c0;
  char cStack_7bf;
  char cStack_7be;
  char cStack_7bd;
  char cStack_7bc;
  char cStack_7bb;
  char cStack_7ba;
  char cStack_7b9;
  char local_7b8;
  char cStack_7b7;
  char cStack_7b6;
  char cStack_7b5;
  char cStack_7b4;
  char cStack_7b3;
  char cStack_7b2;
  char cStack_7b1;
  char cStack_7b0;
  char cStack_7af;
  char cStack_7ae;
  char cStack_7ad;
  char cStack_7ac;
  char cStack_7ab;
  char cStack_7aa;
  char cStack_7a9;
  char local_798;
  char cStack_797;
  char cStack_796;
  char cStack_795;
  char cStack_794;
  char cStack_793;
  char cStack_792;
  char cStack_791;
  char cStack_790;
  char cStack_78f;
  char cStack_78e;
  char cStack_78d;
  char cStack_78c;
  char cStack_78b;
  char cStack_78a;
  char cStack_789;
  char local_788;
  char cStack_787;
  char cStack_786;
  char cStack_785;
  char cStack_784;
  char cStack_783;
  char cStack_782;
  char cStack_781;
  char cStack_780;
  char cStack_77f;
  char cStack_77e;
  char cStack_77d;
  char cStack_77c;
  char cStack_77b;
  char cStack_77a;
  char cStack_779;
  char local_778;
  char cStack_777;
  char cStack_776;
  char cStack_775;
  char cStack_774;
  char cStack_773;
  char cStack_772;
  char cStack_771;
  char cStack_770;
  char cStack_76f;
  char cStack_76e;
  char cStack_76d;
  char cStack_76c;
  char cStack_76b;
  char cStack_76a;
  char cStack_769;
  char local_758;
  char cStack_757;
  char cStack_756;
  char cStack_755;
  char cStack_754;
  char cStack_753;
  char cStack_752;
  char cStack_751;
  char cStack_750;
  char cStack_74f;
  char cStack_74e;
  char cStack_74d;
  char cStack_74c;
  char cStack_74b;
  char cStack_74a;
  char cStack_749;
  char local_738;
  char cStack_737;
  char cStack_736;
  char cStack_735;
  char cStack_734;
  char cStack_733;
  char cStack_732;
  char cStack_731;
  char cStack_730;
  char cStack_72f;
  char cStack_72e;
  char cStack_72d;
  char cStack_72c;
  char cStack_72b;
  char cStack_72a;
  char cStack_729;
  char local_708;
  char cStack_707;
  char cStack_706;
  char cStack_705;
  char cStack_704;
  char cStack_703;
  char cStack_702;
  char cStack_701;
  char cStack_700;
  char cStack_6ff;
  char cStack_6fe;
  char cStack_6fd;
  char cStack_6fc;
  char cStack_6fb;
  char cStack_6fa;
  char cStack_6f9;
  byte local_6f8;
  byte bStack_6f7;
  byte bStack_6f6;
  byte bStack_6f5;
  byte bStack_6f4;
  byte bStack_6f3;
  byte bStack_6f2;
  byte bStack_6f1;
  byte bStack_6f0;
  byte bStack_6ef;
  byte bStack_6ee;
  byte bStack_6ed;
  byte bStack_6ec;
  byte bStack_6eb;
  byte bStack_6ea;
  byte bStack_6e9;
  char local_6d8;
  char cStack_6d7;
  char cStack_6d6;
  char cStack_6d5;
  char cStack_6d4;
  char cStack_6d3;
  char cStack_6d2;
  char cStack_6d1;
  char cStack_6d0;
  char cStack_6cf;
  char cStack_6ce;
  char cStack_6cd;
  char cStack_6cc;
  char cStack_6cb;
  char cStack_6ca;
  char cStack_6c9;
  byte local_6c8;
  byte bStack_6c7;
  byte bStack_6c6;
  byte bStack_6c5;
  byte bStack_6c4;
  byte bStack_6c3;
  byte bStack_6c2;
  byte bStack_6c1;
  byte bStack_6c0;
  byte bStack_6bf;
  byte bStack_6be;
  byte bStack_6bd;
  byte bStack_6bc;
  byte bStack_6bb;
  byte bStack_6ba;
  byte bStack_6b9;
  char local_288;
  char cStack_287;
  char cStack_286;
  char cStack_285;
  char cStack_284;
  char cStack_283;
  char cStack_282;
  char cStack_281;
  char cStack_280;
  char cStack_27f;
  char cStack_27e;
  char cStack_27d;
  char cStack_27c;
  char cStack_27b;
  char cStack_27a;
  char cStack_279;
  char local_268;
  char cStack_267;
  char cStack_266;
  char cStack_265;
  char cStack_264;
  char cStack_263;
  char cStack_262;
  char cStack_261;
  char cStack_260;
  char cStack_25f;
  char cStack_25e;
  char cStack_25d;
  char cStack_25c;
  char cStack_25b;
  char cStack_25a;
  char cStack_259;
  char local_1a8;
  char cStack_1a7;
  char cStack_1a6;
  char cStack_1a5;
  char cStack_1a4;
  char cStack_1a3;
  char cStack_1a2;
  char cStack_1a1;
  char cStack_1a0;
  char cStack_19f;
  char cStack_19e;
  char cStack_19d;
  char cStack_19c;
  char cStack_19b;
  char cStack_19a;
  char cStack_199;
  char local_198;
  char cStack_197;
  char cStack_196;
  char cStack_195;
  char cStack_194;
  char cStack_193;
  char cStack_192;
  char cStack_191;
  char cStack_190;
  char cStack_18f;
  char cStack_18e;
  char cStack_18d;
  char cStack_18c;
  char cStack_18b;
  char cStack_18a;
  char cStack_189;
  char local_188;
  char cStack_187;
  char cStack_186;
  char cStack_185;
  char cStack_184;
  char cStack_183;
  char cStack_182;
  char cStack_181;
  char cStack_180;
  char cStack_17f;
  char cStack_17e;
  char cStack_17d;
  char cStack_17c;
  char cStack_17b;
  char cStack_17a;
  char cStack_179;
  char local_158;
  char cStack_157;
  char cStack_156;
  char cStack_155;
  char cStack_154;
  char cStack_153;
  char cStack_152;
  char cStack_151;
  char cStack_150;
  char cStack_14f;
  char cStack_14e;
  char cStack_14d;
  char cStack_14c;
  char cStack_14b;
  char cStack_14a;
  char cStack_149;
  char local_148;
  char cStack_147;
  char cStack_146;
  char cStack_145;
  char cStack_144;
  char cStack_143;
  char cStack_142;
  char cStack_141;
  char cStack_140;
  char cStack_13f;
  char cStack_13e;
  char cStack_13d;
  char cStack_13c;
  char cStack_13b;
  char cStack_13a;
  char cStack_139;
  ulong uStack_50;
  char local_28;
  char cStack_27;
  char cStack_26;
  char cStack_25;
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char cStack_20;
  char cStack_1f;
  char cStack_1e;
  char cStack_1d;
  char cStack_1c;
  char cStack_1b;
  char cStack_1a;
  char cStack_19;
  size_t len;
  
  _segNum = (parasail_profile_t *)0x0;
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_striped_profile_sse41_128_8",
            "profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile8).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_striped_profile_sse41_128_8",
            "profile->profile8.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_striped_profile_sse41_128_8",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_stats_striped_profile_sse41_128_8",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_striped_profile_sse41_128_8","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_stats_striped_profile_sse41_128_8",
            "s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_stats_striped_profile_sse41_128_8",
            "open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_stats_striped_profile_sse41_128_8",
            "gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    matrix._0_4_ = s2Len + -1;
    ppVar3 = profile->matrix;
    iVar60 = (iVar1 + 0xf) / 0x10;
    iVar66 = (iVar1 + -1) % iVar60;
    iVar61 = ~((iVar1 + -1) / iVar60) + 0x10;
    pvVar4 = (profile->profile8).score;
    pvVar5 = (profile->profile8).matches;
    pvVar6 = (profile->profile8).similar;
    s1_beg_local._0_1_ = (char)open;
    local_d30._0_3_ = CONCAT21(CONCAT11((char)s1_beg_local,(char)s1_beg_local),(char)s1_beg_local);
    local_d38._0_3_ = CONCAT21(CONCAT11((char)s1_beg_local,(char)s1_beg_local),(char)s1_beg_local);
    uVar11 = CONCAT17((char)s1_beg_local,
                      CONCAT16((char)s1_beg_local,
                               CONCAT15((char)s1_beg_local,
                                        CONCAT14((char)s1_beg_local,
                                                 CONCAT13((char)s1_beg_local,local_d38._0_3_)))));
    uVar14 = CONCAT17((char)s1_beg_local,
                      CONCAT16((char)s1_beg_local,
                               CONCAT15((char)s1_beg_local,
                                        CONCAT14((char)s1_beg_local,
                                                 CONCAT13((char)s1_beg_local,local_d30._0_3_)))));
    i._0_1_ = (undefined1)gap;
    local_d10._0_3_ = CONCAT21(CONCAT11((undefined1)i,(undefined1)i),(undefined1)i);
    local_d18._0_3_ = CONCAT21(CONCAT11((undefined1)i,(undefined1)i),(undefined1)i);
    uVar12 = CONCAT17((undefined1)i,
                      CONCAT16((undefined1)i,
                               CONCAT15((undefined1)i,
                                        CONCAT14((undefined1)i,
                                                 CONCAT13((undefined1)i,local_d18._0_3_)))));
    uVar15 = CONCAT17((undefined1)i,
                      CONCAT16((undefined1)i,
                               CONCAT15((undefined1)i,
                                        CONCAT14((undefined1)i,
                                                 CONCAT13((undefined1)i,local_d10._0_3_)))));
    if (ppVar3->min <= -open) {
      s1_beg_local._0_1_ = -(char)ppVar3->min;
    }
    cVar58 = (char)s1_beg_local + -0x7f;
    cVar59 = ((byte)ppVar3->max ^ 0x7f) - 1;
    local_f4a = '\0';
    local_f4b = '\0';
    local_f4c = '\0';
    local_cd0._0_3_ = CONCAT21(CONCAT11(cVar58,cVar58),cVar58);
    local_cd8._0_3_ = CONCAT21(CONCAT11(cVar58,cVar58),cVar58);
    lVar13 = CONCAT17(cVar58,CONCAT16(cVar58,CONCAT15(cVar58,CONCAT14(cVar58,CONCAT13(cVar58,
                                                  local_cd8._0_3_)))));
    lVar16 = CONCAT17(cVar58,CONCAT16(cVar58,CONCAT15(cVar58,CONCAT14(cVar58,CONCAT13(cVar58,
                                                  local_cd0._0_3_)))));
    local_cb0._0_3_ = CONCAT21(CONCAT11(cVar59,cVar59),cVar59);
    local_cb8._0_3_ = CONCAT21(CONCAT11(cVar59,cVar59),cVar59);
    vSaturationCheckMax[1] =
         CONCAT17(cVar59,CONCAT16(cVar59,CONCAT15(cVar59,CONCAT14(cVar59,CONCAT13(cVar59,local_cb8.
                                                                                         _0_3_)))));
    vSaturationCheckMin[0] =
         CONCAT17(cVar59,CONCAT16(cVar59,CONCAT15(cVar59,CONCAT14(cVar59,CONCAT13(cVar59,local_cb0.
                                                                                         _0_3_)))));
    vMaxH[0] = lVar16;
    vMaxHM[1] = lVar13;
    vMaxHM[0] = lVar16;
    vMaxHS[1] = lVar13;
    vMaxHS[0] = lVar16;
    vMaxHL[1] = lVar13;
    vMaxHL[0] = lVar16;
    vPosMask[1] = lVar13;
    vProfile._0_1_ = (char)iVar61;
    result._0_1_ = -((char)vProfile == '\x0f');
    result._1_1_ = -((char)vProfile == '\x0e');
    result._2_1_ = -((char)vProfile == '\r');
    result._3_1_ = -((char)vProfile == '\f');
    result._4_1_ = -((char)vProfile == '\v');
    result._5_1_ = -((char)vProfile == '\n');
    result._6_1_ = -((char)vProfile == '\t');
    result._7_1_ = -((char)vProfile == '\b');
    vPosMask[0]._0_1_ = -((char)vProfile == '\a');
    vPosMask[0]._1_1_ = -((char)vProfile == '\x06');
    vPosMask[0]._2_1_ = -((char)vProfile == '\x05');
    vPosMask[0]._3_1_ = -((char)vProfile == '\x04');
    vPosMask[0]._4_1_ = -((char)vProfile == '\x03');
    vPosMask[0]._5_1_ = -((char)vProfile == '\x02');
    vPosMask[0]._6_1_ = -((char)vProfile == '\x01');
    vPosMask[0]._7_1_ = -((char)vProfile == '\0');
    _segNum = (parasail_profile_t *)parasail_result_new_stats();
    if (_segNum == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x10110802;
      uVar64 = 0;
      if (s1_beg != 0) {
        uVar64 = 8;
      }
      *(uint *)&_segNum->field_0xc = uVar64 | *(uint *)&_segNum->field_0xc;
      uVar64 = 0;
      if (s1_end != 0) {
        uVar64 = 0x10;
      }
      *(uint *)&_segNum->field_0xc = uVar64 | *(uint *)&_segNum->field_0xc;
      uVar64 = 0;
      if (s2_beg != 0) {
        uVar64 = 0x4000;
      }
      *(uint *)&_segNum->field_0xc = uVar64 | *(uint *)&_segNum->field_0xc;
      uVar64 = 0;
      if (s2_end != 0) {
        uVar64 = 0x8000;
      }
      uVar64 = uVar64 | *(uint *)&_segNum->field_0xc;
      len = (size_t)uVar64;
      *(uint *)&_segNum->field_0xc = uVar64;
      pvHLoad = parasail_memalign___m128i(0x10,(long)iVar60);
      pvHMStore = parasail_memalign___m128i(0x10,(long)iVar60);
      pvHMLoad = parasail_memalign___m128i(0x10,(long)iVar60);
      pvHSStore = parasail_memalign___m128i(0x10,(long)iVar60);
      pvHSLoad = parasail_memalign___m128i(0x10,(long)iVar60);
      pvHLStore = parasail_memalign___m128i(0x10,(long)iVar60);
      pvHLLoad = parasail_memalign___m128i(0x10,(long)iVar60);
      pvE = parasail_memalign___m128i(0x10,(long)iVar60);
      ptr = parasail_memalign___m128i(0x10,(long)iVar60);
      b = parasail_memalign___m128i(0x10,(long)iVar60);
      b_00 = parasail_memalign___m128i(0x10,(long)iVar60);
      b_01 = parasail_memalign___m128i(0x10,(long)iVar60);
      ptr_00 = parasail_memalign_int8_t(0x10,(long)(s2Len + 1));
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHMStore == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHMLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHSStore == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHSLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHLStore == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHLLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (int8_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        alVar124[0] = (long)iVar60;
        alVar124[1] = extraout_RDX;
        parasail_memset___m128i(pvHMLoad,alVar124,len);
        alVar125[0] = (long)iVar60;
        alVar125[1] = extraout_RDX_00;
        parasail_memset___m128i(pvHSLoad,alVar125,len);
        alVar126[0] = (long)iVar60;
        alVar126[1] = extraout_RDX_01;
        parasail_memset___m128i(pvHLLoad,alVar126,len);
        alVar127[0] = (long)iVar60;
        alVar127[1] = extraout_RDX_02;
        parasail_memset___m128i(b,alVar127,len);
        alVar128[0] = (long)iVar60;
        alVar128[1] = extraout_RDX_03;
        parasail_memset___m128i(b_00,alVar128,len);
        alVar129[0] = (long)iVar60;
        alVar129[1] = extraout_RDX_04;
        parasail_memset___m128i(b_01,alVar129,len);
        h.m[1]._4_4_ = 0;
        for (k = 0; k < iVar60; k = k + 1) {
          for (h.m[1]._0_4_ = 0; (int)h.m[1]._0_4_ < 0x10; h.m[1]._0_4_ = h.m[1]._0_4_ + 1) {
            if (s1_beg == 0) {
              local_1268 = -(gap * (h.m[1]._0_4_ * iVar60 + k)) - open;
            }
            else {
              local_1268 = 0;
            }
            local_1278 = (long)local_1268;
            local_1270 = local_1278;
            if (local_1278 < -0x80) {
              local_1270 = -0x80;
            }
            e.v[(long)(int)h.m[1]._0_4_ + 8] = (int8_t)local_1270;
            local_1278 = local_1278 - open;
            if (local_1278 < -0x80) {
              local_1278 = -0x80;
            }
            *(char *)((long)&tmp + (long)(int)h.m[1]._0_4_) = (char)local_1278;
          }
          pvHLoad[(int)h.m[1]._4_4_][0] = e.m[1];
          pvHLoad[(int)h.m[1]._4_4_][1] = h.m[0];
          ptr[(int)h.m[1]._4_4_][0] = tmp;
          ptr[(int)h.m[1]._4_4_][1] = e.m[0];
          h.m[1]._4_4_ = h.m[1]._4_4_ + 1;
        }
        *ptr_00 = '\0';
        for (k = 1; k <= s2Len; k = k + 1) {
          if (s2_beg == 0) {
            local_127c = -(gap * (k + -1)) - open;
          }
          else {
            local_127c = 0;
          }
          if (local_127c < -0x80) {
            local_127c = -0x80;
          }
          ptr_00[k] = (int8_t)local_127c;
        }
        vMaxH[1] = lVar13;
        vSaturationCheckMax[0] = lVar16;
        for (s1Len = 0; s1Len < s2Len; s1Len = s1Len + 1) {
          stack0xffffffffffffef48 = ZEXT816(0);
          stack0xffffffffffffef38 = ZEXT816(0);
          vFL[0] = 0x101010101010101;
          vH[1] = 0x101010101010101;
          uVar70 = pvHLoad[iVar60 + -1][0];
          uVar96 = pvHMLoad[iVar60 + -1][0];
          uVar17 = pvHSLoad[iVar60 + -1][0];
          uVar18 = pvHLLoad[iVar60 + -1][0];
          vH[0] = pvHLoad[iVar60 + -1][1] << 8 | uVar70 >> 0x38;
          vHM[0] = pvHMLoad[iVar60 + -1][1] << 8 | uVar96 >> 0x38;
          vHS[1] = uVar96 << 8;
          vHS[0] = pvHSLoad[iVar60 + -1][1] << 8 | uVar17 >> 0x38;
          vHL[1] = uVar17 << 8;
          vHL[0] = pvHLLoad[iVar60 + -1][1] << 8 | uVar18 >> 0x38;
          vP = (__m128i *)(uVar18 << 8);
          vH_dag[1] = uVar70 << 8 | (ulong)(byte)ptr_00[s1Len];
          iVar65 = ppVar3->mapper[(byte)s2[s1Len]] * iVar60;
          iVar62 = ppVar3->mapper[(byte)s2[s1Len]];
          iVar2 = ppVar3->mapper[(byte)s2[s1Len]];
          palVar7 = pvHMStore;
          palVar8 = pvHSStore;
          palVar9 = pvHLStore;
          palVar10 = pvE;
          vF_ext[1] = lVar13;
          vF[0] = lVar16;
          for (k = 0; k < iVar60; k = k + 1) {
            palVar63 = ptr + k;
            lVar19 = (*palVar63)[0];
            lVar20 = (*palVar63)[1];
            alVar124 = *palVar63;
            alVar128 = b[k];
            alVar125 = b[k];
            alVar129 = b_00[k];
            alVar126 = b_00[k];
            alVar57 = b_01[k];
            alVar127 = b_01[k];
            auVar118._8_8_ = vH[0];
            auVar118._0_8_ = vH_dag[1];
            auVar71 = paddsb(auVar118,*(undefined1 (*) [16])
                                       ((long)pvVar4 + (long)k * 0x10 + (long)iVar65 * 0x10));
            local_6c8 = auVar71[0];
            bStack_6c7 = auVar71[1];
            bStack_6c6 = auVar71[2];
            bStack_6c5 = auVar71[3];
            bStack_6c4 = auVar71[4];
            bStack_6c3 = auVar71[5];
            bStack_6c2 = auVar71[6];
            bStack_6c1 = auVar71[7];
            bStack_6c0 = auVar71[8];
            bStack_6bf = auVar71[9];
            bStack_6be = auVar71[10];
            bStack_6bd = auVar71[0xb];
            bStack_6bc = auVar71[0xc];
            bStack_6bb = auVar71[0xd];
            bStack_6ba = auVar71[0xe];
            bStack_6b9 = auVar71[0xf];
            local_6d8 = (char)lVar19;
            cStack_6d7 = (char)((ulong)lVar19 >> 8);
            cStack_6d6 = (char)((ulong)lVar19 >> 0x10);
            cStack_6d5 = (char)((ulong)lVar19 >> 0x18);
            cStack_6d4 = (char)((ulong)lVar19 >> 0x20);
            cStack_6d3 = (char)((ulong)lVar19 >> 0x28);
            cStack_6d2 = (char)((ulong)lVar19 >> 0x30);
            cStack_6d1 = (char)((ulong)lVar19 >> 0x38);
            cStack_6d0 = (char)lVar20;
            cStack_6cf = (char)((ulong)lVar20 >> 8);
            cStack_6ce = (char)((ulong)lVar20 >> 0x10);
            cStack_6cd = (char)((ulong)lVar20 >> 0x18);
            cStack_6cc = (char)((ulong)lVar20 >> 0x20);
            cStack_6cb = (char)((ulong)lVar20 >> 0x28);
            cStack_6ca = (char)((ulong)lVar20 >> 0x30);
            cStack_6c9 = (char)((ulong)lVar20 >> 0x38);
            bVar67 = ((char)local_6c8 < local_6d8) * local_6d8 |
                     ((char)local_6c8 >= local_6d8) * local_6c8;
            bVar72 = ((char)bStack_6c7 < cStack_6d7) * cStack_6d7 |
                     ((char)bStack_6c7 >= cStack_6d7) * bStack_6c7;
            bVar75 = ((char)bStack_6c6 < cStack_6d6) * cStack_6d6 |
                     ((char)bStack_6c6 >= cStack_6d6) * bStack_6c6;
            bVar78 = ((char)bStack_6c5 < cStack_6d5) * cStack_6d5 |
                     ((char)bStack_6c5 >= cStack_6d5) * bStack_6c5;
            bVar81 = ((char)bStack_6c4 < cStack_6d4) * cStack_6d4 |
                     ((char)bStack_6c4 >= cStack_6d4) * bStack_6c4;
            bVar84 = ((char)bStack_6c3 < cStack_6d3) * cStack_6d3 |
                     ((char)bStack_6c3 >= cStack_6d3) * bStack_6c3;
            bVar87 = ((char)bStack_6c2 < cStack_6d2) * cStack_6d2 |
                     ((char)bStack_6c2 >= cStack_6d2) * bStack_6c2;
            bVar90 = ((char)bStack_6c1 < cStack_6d1) * cStack_6d1 |
                     ((char)bStack_6c1 >= cStack_6d1) * bStack_6c1;
            bVar93 = ((char)bStack_6c0 < cStack_6d0) * cStack_6d0 |
                     ((char)bStack_6c0 >= cStack_6d0) * bStack_6c0;
            bVar97 = ((char)bStack_6bf < cStack_6cf) * cStack_6cf |
                     ((char)bStack_6bf >= cStack_6cf) * bStack_6bf;
            bVar100 = ((char)bStack_6be < cStack_6ce) * cStack_6ce |
                      ((char)bStack_6be >= cStack_6ce) * bStack_6be;
            bVar103 = ((char)bStack_6bd < cStack_6cd) * cStack_6cd |
                      ((char)bStack_6bd >= cStack_6cd) * bStack_6bd;
            bVar106 = ((char)bStack_6bc < cStack_6cc) * cStack_6cc |
                      ((char)bStack_6bc >= cStack_6cc) * bStack_6bc;
            bVar109 = ((char)bStack_6bb < cStack_6cb) * cStack_6cb |
                      ((char)bStack_6bb >= cStack_6cb) * bStack_6bb;
            bVar112 = ((char)bStack_6ba < cStack_6ca) * cStack_6ca |
                      ((char)bStack_6ba >= cStack_6ca) * bStack_6ba;
            bVar115 = ((char)bStack_6b9 < cStack_6c9) * cStack_6c9 |
                      ((char)bStack_6b9 >= cStack_6c9) * bStack_6b9;
            local_6f8 = (byte)vF_ext[1];
            bStack_6f7 = (byte)((ulong)vF_ext[1] >> 8);
            bStack_6f6 = (byte)((ulong)vF_ext[1] >> 0x10);
            bStack_6f5 = (byte)((ulong)vF_ext[1] >> 0x18);
            bStack_6f4 = (byte)((ulong)vF_ext[1] >> 0x20);
            bStack_6f3 = (byte)((ulong)vF_ext[1] >> 0x28);
            bStack_6f2 = (byte)((ulong)vF_ext[1] >> 0x30);
            bStack_6f1 = (byte)((ulong)vF_ext[1] >> 0x38);
            bStack_6f0 = (byte)vF[0];
            bStack_6ef = (byte)((ulong)vF[0] >> 8);
            bStack_6ee = (byte)((ulong)vF[0] >> 0x10);
            bStack_6ed = (byte)((ulong)vF[0] >> 0x18);
            bStack_6ec = (byte)((ulong)vF[0] >> 0x20);
            bStack_6eb = (byte)((ulong)vF[0] >> 0x28);
            bStack_6ea = (byte)((ulong)vF[0] >> 0x30);
            bStack_6e9 = (byte)((ulong)vF[0] >> 0x38);
            bVar67 = ((char)bVar67 < (char)local_6f8) * local_6f8 |
                     ((char)bVar67 >= (char)local_6f8) * bVar67;
            bVar72 = ((char)bVar72 < (char)bStack_6f7) * bStack_6f7 |
                     ((char)bVar72 >= (char)bStack_6f7) * bVar72;
            bVar75 = ((char)bVar75 < (char)bStack_6f6) * bStack_6f6 |
                     ((char)bVar75 >= (char)bStack_6f6) * bVar75;
            bVar78 = ((char)bVar78 < (char)bStack_6f5) * bStack_6f5 |
                     ((char)bVar78 >= (char)bStack_6f5) * bVar78;
            bVar81 = ((char)bVar81 < (char)bStack_6f4) * bStack_6f4 |
                     ((char)bVar81 >= (char)bStack_6f4) * bVar81;
            bVar84 = ((char)bVar84 < (char)bStack_6f3) * bStack_6f3 |
                     ((char)bVar84 >= (char)bStack_6f3) * bVar84;
            bVar87 = ((char)bVar87 < (char)bStack_6f2) * bStack_6f2 |
                     ((char)bVar87 >= (char)bStack_6f2) * bVar87;
            bVar90 = ((char)bVar90 < (char)bStack_6f1) * bStack_6f1 |
                     ((char)bVar90 >= (char)bStack_6f1) * bVar90;
            bVar93 = ((char)bVar93 < (char)bStack_6f0) * bStack_6f0 |
                     ((char)bVar93 >= (char)bStack_6f0) * bVar93;
            bVar97 = ((char)bVar97 < (char)bStack_6ef) * bStack_6ef |
                     ((char)bVar97 >= (char)bStack_6ef) * bVar97;
            bVar100 = ((char)bVar100 < (char)bStack_6ee) * bStack_6ee |
                      ((char)bVar100 >= (char)bStack_6ee) * bVar100;
            bVar103 = ((char)bVar103 < (char)bStack_6ed) * bStack_6ed |
                      ((char)bVar103 >= (char)bStack_6ed) * bVar103;
            bVar106 = ((char)bVar106 < (char)bStack_6ec) * bStack_6ec |
                      ((char)bVar106 >= (char)bStack_6ec) * bVar106;
            bVar109 = ((char)bVar109 < (char)bStack_6eb) * bStack_6eb |
                      ((char)bVar109 >= (char)bStack_6eb) * bVar109;
            bVar112 = ((char)bVar112 < (char)bStack_6ea) * bStack_6ea |
                      ((char)bVar112 >= (char)bStack_6ea) * bVar112;
            bVar115 = ((char)bVar115 < (char)bStack_6e9) * bStack_6e9 |
                      ((char)bVar115 >= (char)bStack_6e9) * bVar115;
            vH_dag[1]._0_2_ = CONCAT11(bVar72,bVar67);
            vH_dag[1]._0_3_ = CONCAT12(bVar75,(undefined2)vH_dag[1]);
            vH_dag[1]._0_4_ = CONCAT13(bVar78,(undefined3)vH_dag[1]);
            vH_dag[1]._0_5_ = CONCAT14(bVar81,(undefined4)vH_dag[1]);
            vH_dag[1]._0_6_ = CONCAT15(bVar84,(undefined5)vH_dag[1]);
            vH_dag[1]._0_7_ = CONCAT16(bVar87,(undefined6)vH_dag[1]);
            vH_dag[1] = CONCAT17(bVar90,(undefined7)vH_dag[1]);
            vH[0]._0_2_ = CONCAT11(bVar97,bVar93);
            vH[0]._0_3_ = CONCAT12(bVar100,(undefined2)vH[0]);
            vH[0]._0_4_ = CONCAT13(bVar103,(undefined3)vH[0]);
            vH[0]._0_5_ = CONCAT14(bVar106,(undefined4)vH[0]);
            vH[0]._0_6_ = CONCAT15(bVar109,(undefined5)vH[0]);
            vH[0]._0_7_ = CONCAT16(bVar112,(undefined6)vH[0]);
            vH[0] = CONCAT17(bVar115,(undefined7)vH[0]);
            pvHMStore[k][0] = vH_dag[1];
            pvHMStore[k][1] = vH[0];
            cVar68 = -(bVar67 == local_6c8);
            cVar73 = -(bVar72 == bStack_6c7);
            cVar76 = -(bVar75 == bStack_6c6);
            cVar79 = -(bVar78 == bStack_6c5);
            cVar82 = -(bVar81 == bStack_6c4);
            cVar85 = -(bVar84 == bStack_6c3);
            cVar88 = -(bVar87 == bStack_6c2);
            cVar91 = -(bVar90 == bStack_6c1);
            cVar94 = -(bVar93 == bStack_6c0);
            cVar98 = -(bVar97 == bStack_6bf);
            cVar101 = -(bVar100 == bStack_6be);
            cVar104 = -(bVar103 == bStack_6bd);
            cVar107 = -(bVar106 == bStack_6bc);
            cVar110 = -(bVar109 == bStack_6bb);
            cVar113 = -(bVar112 == bStack_6ba);
            cVar116 = -(bVar115 == bStack_6b9);
            cVar69 = -(bVar67 == local_6f8);
            cVar74 = -(bVar72 == bStack_6f7);
            cVar77 = -(bVar75 == bStack_6f6);
            cVar80 = -(bVar78 == bStack_6f5);
            cVar83 = -(bVar81 == bStack_6f4);
            cVar86 = -(bVar84 == bStack_6f3);
            cVar89 = -(bVar87 == bStack_6f2);
            cVar92 = -(bVar90 == bStack_6f1);
            cVar95 = -(bVar93 == bStack_6f0);
            cVar99 = -(bVar97 == bStack_6ef);
            cVar102 = -(bVar100 == bStack_6ee);
            cVar105 = -(bVar103 == bStack_6ed);
            cVar108 = -(bVar106 == bStack_6ec);
            cVar111 = -(bVar109 == bStack_6eb);
            cVar114 = -(bVar112 == bStack_6ea);
            cVar117 = -(bVar115 == bStack_6e9);
            auVar44[1] = cVar74;
            auVar44[0] = cVar69;
            auVar44[2] = cVar77;
            auVar44[3] = cVar80;
            auVar44[4] = cVar83;
            auVar44[5] = cVar86;
            auVar44[6] = cVar89;
            auVar44[7] = cVar92;
            auVar44[9] = cVar99;
            auVar44[8] = cVar95;
            auVar44[10] = cVar102;
            auVar44[0xb] = cVar105;
            auVar44[0xc] = cVar108;
            auVar44[0xd] = cVar111;
            auVar44[0xe] = cVar114;
            auVar44[0xf] = cVar117;
            auVar122 = pblendvb((undefined1  [16])alVar128,stack0xffffffffffffef48,auVar44);
            auVar71 = paddsb((undefined1  [16])stack0xffffffffffffeef8,
                             *(undefined1 (*) [16])
                              ((long)pvVar5 + (long)k * 0x10 + (long)(iVar62 * iVar60) * 0x10));
            auVar43[1] = cVar73;
            auVar43[0] = cVar68;
            auVar43[2] = cVar76;
            auVar43[3] = cVar79;
            auVar43[4] = cVar82;
            auVar43[5] = cVar85;
            auVar43[6] = cVar88;
            auVar43[7] = cVar91;
            auVar43[9] = cVar98;
            auVar43[8] = cVar94;
            auVar43[10] = cVar101;
            auVar43[0xb] = cVar104;
            auVar43[0xc] = cVar107;
            auVar43[0xd] = cVar110;
            auVar43[0xe] = cVar113;
            auVar43[0xf] = cVar116;
            auVar118 = pblendvb(auVar122,auVar71,auVar43);
            vHS[1] = auVar118._0_8_;
            vHM[0] = auVar118._8_8_;
            pvHSStore[k][0] = vHS[1];
            pvHSStore[k][1] = vHM[0];
            auVar42[1] = cVar74;
            auVar42[0] = cVar69;
            auVar42[2] = cVar77;
            auVar42[3] = cVar80;
            auVar42[4] = cVar83;
            auVar42[5] = cVar86;
            auVar42[6] = cVar89;
            auVar42[7] = cVar92;
            auVar42[9] = cVar99;
            auVar42[8] = cVar95;
            auVar42[10] = cVar102;
            auVar42[0xb] = cVar105;
            auVar42[0xc] = cVar108;
            auVar42[0xd] = cVar111;
            auVar42[0xe] = cVar114;
            auVar42[0xf] = cVar117;
            auVar122 = pblendvb((undefined1  [16])alVar129,stack0xffffffffffffef38,auVar42);
            auVar71 = paddsb((undefined1  [16])stack0xffffffffffffeee8,
                             *(undefined1 (*) [16])
                              ((long)pvVar6 + (long)k * 0x10 + (long)(iVar2 * iVar60) * 0x10));
            auVar41[1] = cVar73;
            auVar41[0] = cVar68;
            auVar41[2] = cVar76;
            auVar41[3] = cVar79;
            auVar41[4] = cVar82;
            auVar41[5] = cVar85;
            auVar41[6] = cVar88;
            auVar41[7] = cVar91;
            auVar41[9] = cVar98;
            auVar41[8] = cVar94;
            auVar41[10] = cVar101;
            auVar41[0xb] = cVar104;
            auVar41[0xc] = cVar107;
            auVar41[0xd] = cVar110;
            auVar41[0xe] = cVar113;
            auVar41[0xf] = cVar116;
            auVar119 = pblendvb(auVar122,auVar71,auVar41);
            vHL[1] = auVar119._0_8_;
            vHS[0] = auVar119._8_8_;
            pvHLStore[k][0] = vHL[1];
            pvHLStore[k][1] = vHS[0];
            auVar40[1] = cVar74;
            auVar40[0] = cVar69;
            auVar40[2] = cVar77;
            auVar40[3] = cVar80;
            auVar40[4] = cVar83;
            auVar40[5] = cVar86;
            auVar40[6] = cVar89;
            auVar40[7] = cVar92;
            auVar40[9] = cVar99;
            auVar40[8] = cVar95;
            auVar40[10] = cVar102;
            auVar40[0xb] = cVar105;
            auVar40[0xc] = cVar108;
            auVar40[0xd] = cVar111;
            auVar40[0xe] = cVar114;
            auVar40[0xf] = cVar117;
            auVar122 = pblendvb((undefined1  [16])alVar57,stack0xffffffffffffef28,auVar40);
            auVar120._8_8_ = 0x101010101010101;
            auVar120._0_8_ = 0x101010101010101;
            auVar71 = paddsb((undefined1  [16])_vP,auVar120);
            auVar39[1] = cVar73;
            auVar39[0] = cVar68;
            auVar39[2] = cVar76;
            auVar39[3] = cVar79;
            auVar39[4] = cVar82;
            auVar39[5] = cVar85;
            auVar39[6] = cVar88;
            auVar39[7] = cVar91;
            auVar39[9] = cVar98;
            auVar39[8] = cVar94;
            auVar39[10] = cVar101;
            auVar39[0xb] = cVar104;
            auVar39[0xc] = cVar107;
            auVar39[0xd] = cVar110;
            auVar39[0xe] = cVar113;
            auVar39[0xf] = cVar116;
            auVar120 = pblendvb(auVar122,auVar71,auVar39);
            vP = auVar120._0_8_;
            vHL[0] = auVar120._8_8_;
            pvE[k][0] = (longlong)vP;
            pvE[k][1] = vHL[0];
            local_268 = (char)vSaturationCheckMax[1];
            cStack_267 = (char)((ulong)vSaturationCheckMax[1] >> 8);
            cStack_266 = (char)((ulong)vSaturationCheckMax[1] >> 0x10);
            cStack_265 = (char)((ulong)vSaturationCheckMax[1] >> 0x18);
            cStack_264 = (char)((ulong)vSaturationCheckMax[1] >> 0x20);
            cStack_263 = (char)((ulong)vSaturationCheckMax[1] >> 0x28);
            cStack_262 = (char)((ulong)vSaturationCheckMax[1] >> 0x30);
            cStack_261 = (char)((ulong)vSaturationCheckMax[1] >> 0x38);
            cStack_260 = (char)vSaturationCheckMin[0];
            cStack_25f = (char)((ulong)vSaturationCheckMin[0] >> 8);
            cStack_25e = (char)((ulong)vSaturationCheckMin[0] >> 0x10);
            cStack_25d = (char)((ulong)vSaturationCheckMin[0] >> 0x18);
            cStack_25c = (char)((ulong)vSaturationCheckMin[0] >> 0x20);
            cStack_25b = (char)((ulong)vSaturationCheckMin[0] >> 0x28);
            cStack_25a = (char)((ulong)vSaturationCheckMin[0] >> 0x30);
            cStack_259 = (char)((ulong)vSaturationCheckMin[0] >> 0x38);
            vSaturationCheckMax[1]._0_2_ =
                 CONCAT11(((char)bVar72 < cStack_267) * bVar72 |
                          ((char)bVar72 >= cStack_267) * cStack_267,
                          ((char)bVar67 < local_268) * bVar67 |
                          ((char)bVar67 >= local_268) * local_268);
            vSaturationCheckMax[1]._0_3_ =
                 CONCAT12(((char)bVar75 < cStack_266) * bVar75 |
                          ((char)bVar75 >= cStack_266) * cStack_266,
                          (undefined2)vSaturationCheckMax[1]);
            vSaturationCheckMax[1]._0_4_ =
                 CONCAT13(((char)bVar78 < cStack_265) * bVar78 |
                          ((char)bVar78 >= cStack_265) * cStack_265,
                          (undefined3)vSaturationCheckMax[1]);
            vSaturationCheckMax[1]._0_5_ =
                 CONCAT14(((char)bVar81 < cStack_264) * bVar81 |
                          ((char)bVar81 >= cStack_264) * cStack_264,
                          (undefined4)vSaturationCheckMax[1]);
            vSaturationCheckMax[1]._0_6_ =
                 CONCAT15(((char)bVar84 < cStack_263) * bVar84 |
                          ((char)bVar84 >= cStack_263) * cStack_263,
                          (undefined5)vSaturationCheckMax[1]);
            vSaturationCheckMax[1]._0_7_ =
                 CONCAT16(((char)bVar87 < cStack_262) * bVar87 |
                          ((char)bVar87 >= cStack_262) * cStack_262,
                          (undefined6)vSaturationCheckMax[1]);
            vSaturationCheckMax[1] =
                 CONCAT17(((char)bVar90 < cStack_261) * bVar90 |
                          ((char)bVar90 >= cStack_261) * cStack_261,
                          (undefined7)vSaturationCheckMax[1]);
            vSaturationCheckMin[0]._0_2_ =
                 CONCAT11(((char)bVar97 < cStack_25f) * bVar97 |
                          ((char)bVar97 >= cStack_25f) * cStack_25f,
                          ((char)bVar93 < cStack_260) * bVar93 |
                          ((char)bVar93 >= cStack_260) * cStack_260);
            vSaturationCheckMin[0]._0_3_ =
                 CONCAT12(((char)bVar100 < cStack_25e) * bVar100 |
                          ((char)bVar100 >= cStack_25e) * cStack_25e,
                          (undefined2)vSaturationCheckMin[0]);
            vSaturationCheckMin[0]._0_4_ =
                 CONCAT13(((char)bVar103 < cStack_25d) * bVar103 |
                          ((char)bVar103 >= cStack_25d) * cStack_25d,
                          (undefined3)vSaturationCheckMin[0]);
            vSaturationCheckMin[0]._0_5_ =
                 CONCAT14(((char)bVar106 < cStack_25c) * bVar106 |
                          ((char)bVar106 >= cStack_25c) * cStack_25c,
                          (undefined4)vSaturationCheckMin[0]);
            vSaturationCheckMin[0]._0_6_ =
                 CONCAT15(((char)bVar109 < cStack_25b) * bVar109 |
                          ((char)bVar109 >= cStack_25b) * cStack_25b,
                          (undefined5)vSaturationCheckMin[0]);
            vSaturationCheckMin[0]._0_7_ =
                 CONCAT16(((char)bVar112 < cStack_25a) * bVar112 |
                          ((char)bVar112 >= cStack_25a) * cStack_25a,
                          (undefined6)vSaturationCheckMin[0]);
            vSaturationCheckMin[0] =
                 CONCAT17(((char)bVar115 < cStack_259) * bVar115 |
                          ((char)bVar115 >= cStack_259) * cStack_259,
                          (undefined7)vSaturationCheckMin[0]);
            local_708 = (char)vMaxH[1];
            cStack_707 = (char)((ulong)vMaxH[1] >> 8);
            cStack_706 = (char)((ulong)vMaxH[1] >> 0x10);
            cStack_705 = (char)((ulong)vMaxH[1] >> 0x18);
            cStack_704 = (char)((ulong)vMaxH[1] >> 0x20);
            cStack_703 = (char)((ulong)vMaxH[1] >> 0x28);
            cStack_702 = (char)((ulong)vMaxH[1] >> 0x30);
            cStack_701 = (char)((ulong)vMaxH[1] >> 0x38);
            cStack_700 = (char)vSaturationCheckMax[0];
            cStack_6ff = (char)((ulong)vSaturationCheckMax[0] >> 8);
            cStack_6fe = (char)((ulong)vSaturationCheckMax[0] >> 0x10);
            cStack_6fd = (char)((ulong)vSaturationCheckMax[0] >> 0x18);
            cStack_6fc = (char)((ulong)vSaturationCheckMax[0] >> 0x20);
            cStack_6fb = (char)((ulong)vSaturationCheckMax[0] >> 0x28);
            cStack_6fa = (char)((ulong)vSaturationCheckMax[0] >> 0x30);
            cStack_6f9 = (char)((ulong)vSaturationCheckMax[0] >> 0x38);
            bVar67 = (local_708 < (char)bVar67) * bVar67 | (local_708 >= (char)bVar67) * local_708;
            bVar72 = (cStack_707 < (char)bVar72) * bVar72 |
                     (cStack_707 >= (char)bVar72) * cStack_707;
            bVar75 = (cStack_706 < (char)bVar75) * bVar75 |
                     (cStack_706 >= (char)bVar75) * cStack_706;
            bVar78 = (cStack_705 < (char)bVar78) * bVar78 |
                     (cStack_705 >= (char)bVar78) * cStack_705;
            bVar81 = (cStack_704 < (char)bVar81) * bVar81 |
                     (cStack_704 >= (char)bVar81) * cStack_704;
            bVar84 = (cStack_703 < (char)bVar84) * bVar84 |
                     (cStack_703 >= (char)bVar84) * cStack_703;
            bVar87 = (cStack_702 < (char)bVar87) * bVar87 |
                     (cStack_702 >= (char)bVar87) * cStack_702;
            bVar90 = (cStack_701 < (char)bVar90) * bVar90 |
                     (cStack_701 >= (char)bVar90) * cStack_701;
            bVar93 = (cStack_700 < (char)bVar93) * bVar93 |
                     (cStack_700 >= (char)bVar93) * cStack_700;
            bVar97 = (cStack_6ff < (char)bVar97) * bVar97 |
                     (cStack_6ff >= (char)bVar97) * cStack_6ff;
            bVar100 = (cStack_6fe < (char)bVar100) * bVar100 |
                      (cStack_6fe >= (char)bVar100) * cStack_6fe;
            bVar103 = (cStack_6fd < (char)bVar103) * bVar103 |
                      (cStack_6fd >= (char)bVar103) * cStack_6fd;
            bVar106 = (cStack_6fc < (char)bVar106) * bVar106 |
                      (cStack_6fc >= (char)bVar106) * cStack_6fc;
            bVar109 = (cStack_6fb < (char)bVar109) * bVar109 |
                      (cStack_6fb >= (char)bVar109) * cStack_6fb;
            bVar112 = (cStack_6fa < (char)bVar112) * bVar112 |
                      (cStack_6fa >= (char)bVar112) * cStack_6fa;
            bVar115 = (cStack_6f9 < (char)bVar115) * bVar115 |
                      (cStack_6f9 >= (char)bVar115) * cStack_6f9;
            local_738 = auVar118[0];
            cStack_737 = auVar118[1];
            cStack_736 = auVar118[2];
            cStack_735 = auVar118[3];
            cStack_734 = auVar118[4];
            cStack_733 = auVar118[5];
            cStack_732 = auVar118[6];
            cStack_731 = auVar118[7];
            cStack_730 = auVar118[8];
            cStack_72f = auVar118[9];
            cStack_72e = auVar118[10];
            cStack_72d = auVar118[0xb];
            cStack_72c = auVar118[0xc];
            cStack_72b = auVar118[0xd];
            cStack_72a = auVar118[0xe];
            cStack_729 = auVar118[0xf];
            bVar67 = ((char)bVar67 < local_738) * local_738 | ((char)bVar67 >= local_738) * bVar67;
            bVar72 = ((char)bVar72 < cStack_737) * cStack_737 |
                     ((char)bVar72 >= cStack_737) * bVar72;
            bVar75 = ((char)bVar75 < cStack_736) * cStack_736 |
                     ((char)bVar75 >= cStack_736) * bVar75;
            bVar78 = ((char)bVar78 < cStack_735) * cStack_735 |
                     ((char)bVar78 >= cStack_735) * bVar78;
            bVar81 = ((char)bVar81 < cStack_734) * cStack_734 |
                     ((char)bVar81 >= cStack_734) * bVar81;
            bVar84 = ((char)bVar84 < cStack_733) * cStack_733 |
                     ((char)bVar84 >= cStack_733) * bVar84;
            bVar87 = ((char)bVar87 < cStack_732) * cStack_732 |
                     ((char)bVar87 >= cStack_732) * bVar87;
            bVar90 = ((char)bVar90 < cStack_731) * cStack_731 |
                     ((char)bVar90 >= cStack_731) * bVar90;
            bVar93 = ((char)bVar93 < cStack_730) * cStack_730 |
                     ((char)bVar93 >= cStack_730) * bVar93;
            bVar97 = ((char)bVar97 < cStack_72f) * cStack_72f |
                     ((char)bVar97 >= cStack_72f) * bVar97;
            bVar100 = ((char)bVar100 < cStack_72e) * cStack_72e |
                      ((char)bVar100 >= cStack_72e) * bVar100;
            bVar103 = ((char)bVar103 < cStack_72d) * cStack_72d |
                      ((char)bVar103 >= cStack_72d) * bVar103;
            bVar106 = ((char)bVar106 < cStack_72c) * cStack_72c |
                      ((char)bVar106 >= cStack_72c) * bVar106;
            bVar109 = ((char)bVar109 < cStack_72b) * cStack_72b |
                      ((char)bVar109 >= cStack_72b) * bVar109;
            bVar112 = ((char)bVar112 < cStack_72a) * cStack_72a |
                      ((char)bVar112 >= cStack_72a) * bVar112;
            bVar115 = ((char)bVar115 < cStack_729) * cStack_729 |
                      ((char)bVar115 >= cStack_729) * bVar115;
            local_758 = auVar119[0];
            cStack_757 = auVar119[1];
            cStack_756 = auVar119[2];
            cStack_755 = auVar119[3];
            cStack_754 = auVar119[4];
            cStack_753 = auVar119[5];
            cStack_752 = auVar119[6];
            cStack_751 = auVar119[7];
            cStack_750 = auVar119[8];
            cStack_74f = auVar119[9];
            cStack_74e = auVar119[10];
            cStack_74d = auVar119[0xb];
            cStack_74c = auVar119[0xc];
            cStack_74b = auVar119[0xd];
            cStack_74a = auVar119[0xe];
            cStack_749 = auVar119[0xf];
            bVar67 = ((char)bVar67 < local_758) * local_758 | ((char)bVar67 >= local_758) * bVar67;
            bVar72 = ((char)bVar72 < cStack_757) * cStack_757 |
                     ((char)bVar72 >= cStack_757) * bVar72;
            bVar75 = ((char)bVar75 < cStack_756) * cStack_756 |
                     ((char)bVar75 >= cStack_756) * bVar75;
            bVar78 = ((char)bVar78 < cStack_755) * cStack_755 |
                     ((char)bVar78 >= cStack_755) * bVar78;
            bVar81 = ((char)bVar81 < cStack_754) * cStack_754 |
                     ((char)bVar81 >= cStack_754) * bVar81;
            bVar84 = ((char)bVar84 < cStack_753) * cStack_753 |
                     ((char)bVar84 >= cStack_753) * bVar84;
            bVar87 = ((char)bVar87 < cStack_752) * cStack_752 |
                     ((char)bVar87 >= cStack_752) * bVar87;
            bVar90 = ((char)bVar90 < cStack_751) * cStack_751 |
                     ((char)bVar90 >= cStack_751) * bVar90;
            bVar93 = ((char)bVar93 < cStack_750) * cStack_750 |
                     ((char)bVar93 >= cStack_750) * bVar93;
            bVar97 = ((char)bVar97 < cStack_74f) * cStack_74f |
                     ((char)bVar97 >= cStack_74f) * bVar97;
            bVar100 = ((char)bVar100 < cStack_74e) * cStack_74e |
                      ((char)bVar100 >= cStack_74e) * bVar100;
            bVar103 = ((char)bVar103 < cStack_74d) * cStack_74d |
                      ((char)bVar103 >= cStack_74d) * bVar103;
            bVar106 = ((char)bVar106 < cStack_74c) * cStack_74c |
                      ((char)bVar106 >= cStack_74c) * bVar106;
            bVar109 = ((char)bVar109 < cStack_74b) * cStack_74b |
                      ((char)bVar109 >= cStack_74b) * bVar109;
            bVar112 = ((char)bVar112 < cStack_74a) * cStack_74a |
                      ((char)bVar112 >= cStack_74a) * bVar112;
            bVar115 = ((char)bVar115 < cStack_749) * cStack_749 |
                      ((char)bVar115 >= cStack_749) * bVar115;
            local_778 = auVar120[0];
            cStack_777 = auVar120[1];
            cStack_776 = auVar120[2];
            cStack_775 = auVar120[3];
            cStack_774 = auVar120[4];
            cStack_773 = auVar120[5];
            cStack_772 = auVar120[6];
            cStack_771 = auVar120[7];
            cStack_770 = auVar120[8];
            cStack_76f = auVar120[9];
            cStack_76e = auVar120[10];
            cStack_76d = auVar120[0xb];
            cStack_76c = auVar120[0xc];
            cStack_76b = auVar120[0xd];
            cStack_76a = auVar120[0xe];
            cStack_769 = auVar120[0xf];
            vMaxH[1]._0_2_ =
                 CONCAT11(((char)bVar72 < cStack_777) * cStack_777 |
                          ((char)bVar72 >= cStack_777) * bVar72,
                          ((char)bVar67 < local_778) * local_778 |
                          ((char)bVar67 >= local_778) * bVar67);
            vMaxH[1]._0_3_ =
                 CONCAT12(((char)bVar75 < cStack_776) * cStack_776 |
                          ((char)bVar75 >= cStack_776) * bVar75,(undefined2)vMaxH[1]);
            vMaxH[1]._0_4_ =
                 CONCAT13(((char)bVar78 < cStack_775) * cStack_775 |
                          ((char)bVar78 >= cStack_775) * bVar78,(undefined3)vMaxH[1]);
            vMaxH[1]._0_5_ =
                 CONCAT14(((char)bVar81 < cStack_774) * cStack_774 |
                          ((char)bVar81 >= cStack_774) * bVar81,(undefined4)vMaxH[1]);
            vMaxH[1]._0_6_ =
                 CONCAT15(((char)bVar84 < cStack_773) * cStack_773 |
                          ((char)bVar84 >= cStack_773) * bVar84,(undefined5)vMaxH[1]);
            vMaxH[1]._0_7_ =
                 CONCAT16(((char)bVar87 < cStack_772) * cStack_772 |
                          ((char)bVar87 >= cStack_772) * bVar87,(undefined6)vMaxH[1]);
            vMaxH[1] = CONCAT17(((char)bVar90 < cStack_771) * cStack_771 |
                                ((char)bVar90 >= cStack_771) * bVar90,(undefined7)vMaxH[1]);
            vSaturationCheckMax[0]._0_2_ =
                 CONCAT11(((char)bVar97 < cStack_76f) * cStack_76f |
                          ((char)bVar97 >= cStack_76f) * bVar97,
                          ((char)bVar93 < cStack_770) * cStack_770 |
                          ((char)bVar93 >= cStack_770) * bVar93);
            vSaturationCheckMax[0]._0_3_ =
                 CONCAT12(((char)bVar100 < cStack_76e) * cStack_76e |
                          ((char)bVar100 >= cStack_76e) * bVar100,(undefined2)vSaturationCheckMax[0]
                         );
            vSaturationCheckMax[0]._0_4_ =
                 CONCAT13(((char)bVar103 < cStack_76d) * cStack_76d |
                          ((char)bVar103 >= cStack_76d) * bVar103,(undefined3)vSaturationCheckMax[0]
                         );
            vSaturationCheckMax[0]._0_5_ =
                 CONCAT14(((char)bVar106 < cStack_76c) * cStack_76c |
                          ((char)bVar106 >= cStack_76c) * bVar106,(undefined4)vSaturationCheckMax[0]
                         );
            vSaturationCheckMax[0]._0_6_ =
                 CONCAT15(((char)bVar109 < cStack_76b) * cStack_76b |
                          ((char)bVar109 >= cStack_76b) * bVar109,(undefined5)vSaturationCheckMax[0]
                         );
            vSaturationCheckMax[0]._0_7_ =
                 CONCAT16(((char)bVar112 < cStack_76a) * cStack_76a |
                          ((char)bVar112 >= cStack_76a) * bVar112,(undefined6)vSaturationCheckMax[0]
                         );
            vSaturationCheckMax[0] =
                 CONCAT17(((char)bVar115 < cStack_769) * cStack_769 |
                          ((char)bVar115 >= cStack_769) * bVar115,(undefined7)vSaturationCheckMax[0]
                         );
            auVar53._8_8_ = vH[0];
            auVar53._0_8_ = vH_dag[1];
            auVar52._8_8_ = uVar14;
            auVar52._0_8_ = uVar11;
            auVar71 = psubsb(auVar53,auVar52);
            auVar51._8_8_ = uVar15;
            auVar51._0_8_ = uVar12;
            auVar122 = psubsb((undefined1  [16])alVar124,auVar51);
            local_788 = auVar71[0];
            cStack_787 = auVar71[1];
            cStack_786 = auVar71[2];
            cStack_785 = auVar71[3];
            cStack_784 = auVar71[4];
            cStack_783 = auVar71[5];
            cStack_782 = auVar71[6];
            cStack_781 = auVar71[7];
            cStack_780 = auVar71[8];
            cStack_77f = auVar71[9];
            cStack_77e = auVar71[10];
            cStack_77d = auVar71[0xb];
            cStack_77c = auVar71[0xc];
            cStack_77b = auVar71[0xd];
            cStack_77a = auVar71[0xe];
            cStack_779 = auVar71[0xf];
            local_798 = auVar122[0];
            cStack_797 = auVar122[1];
            cStack_796 = auVar122[2];
            cStack_795 = auVar122[3];
            cStack_794 = auVar122[4];
            cStack_793 = auVar122[5];
            cStack_792 = auVar122[6];
            cStack_791 = auVar122[7];
            cStack_790 = auVar122[8];
            cStack_78f = auVar122[9];
            cStack_78e = auVar122[10];
            cStack_78d = auVar122[0xb];
            cStack_78c = auVar122[0xc];
            cStack_78b = auVar122[0xd];
            cStack_78a = auVar122[0xe];
            cStack_789 = auVar122[0xf];
            vE_ext[1] = CONCAT17((cStack_781 < cStack_791) * cStack_791 |
                                 (cStack_781 >= cStack_791) * cStack_781,
                                 CONCAT16((cStack_782 < cStack_792) * cStack_792 |
                                          (cStack_782 >= cStack_792) * cStack_782,
                                          CONCAT15((cStack_783 < cStack_793) * cStack_793 |
                                                   (cStack_783 >= cStack_793) * cStack_783,
                                                   CONCAT14((cStack_784 < cStack_794) * cStack_794 |
                                                            (cStack_784 >= cStack_794) * cStack_784,
                                                            CONCAT13((cStack_785 < cStack_795) *
                                                                     cStack_795 |
                                                                     (cStack_785 >= cStack_795) *
                                                                     cStack_785,
                                                                     CONCAT12((cStack_786 <
                                                                              cStack_796) *
                                                                              cStack_796 |
                                                                              (cStack_786 >=
                                                                              cStack_796) *
                                                                              cStack_786,
                                                                              CONCAT11((cStack_787 <
                                                                                       cStack_797) *
                                                                                       cStack_797 |
                                                                                       (cStack_787
                                                                                       >= cStack_797
                                                                                       ) * 
                                                  cStack_787,
                                                  (local_788 < local_798) * local_798 |
                                                  (local_788 >= local_798) * local_788)))))));
            vE[0] = CONCAT17((cStack_779 < cStack_789) * cStack_789 |
                             (cStack_779 >= cStack_789) * cStack_779,
                             CONCAT16((cStack_77a < cStack_78a) * cStack_78a |
                                      (cStack_77a >= cStack_78a) * cStack_77a,
                                      CONCAT15((cStack_77b < cStack_78b) * cStack_78b |
                                               (cStack_77b >= cStack_78b) * cStack_77b,
                                               CONCAT14((cStack_77c < cStack_78c) * cStack_78c |
                                                        (cStack_77c >= cStack_78c) * cStack_77c,
                                                        CONCAT13((cStack_77d < cStack_78d) *
                                                                 cStack_78d |
                                                                 (cStack_77d >= cStack_78d) *
                                                                 cStack_77d,
                                                                 CONCAT12((cStack_77e < cStack_78e)
                                                                          * cStack_78e |
                                                                          (cStack_77e >= cStack_78e)
                                                                          * cStack_77e,
                                                                          CONCAT11((cStack_77f <
                                                                                   cStack_78f) *
                                                                                   cStack_78f |
                                                                                   (cStack_77f >=
                                                                                   cStack_78f) *
                                                                                   cStack_77f,
                                                                                   (cStack_780 <
                                                                                   cStack_790) *
                                                                                   cStack_790 |
                                                                                   (cStack_780 >=
                                                                                   cStack_790) *
                                                                                   cStack_780)))))))
            ;
            cVar68 = -(local_798 < local_788);
            cVar69 = -(cStack_797 < cStack_787);
            cVar73 = -(cStack_796 < cStack_786);
            cVar74 = -(cStack_795 < cStack_785);
            cVar76 = -(cStack_794 < cStack_784);
            cVar77 = -(cStack_793 < cStack_783);
            cVar79 = -(cStack_792 < cStack_782);
            cVar80 = -(cStack_791 < cStack_781);
            cVar82 = -(cStack_790 < cStack_780);
            cVar83 = -(cStack_78f < cStack_77f);
            cVar85 = -(cStack_78e < cStack_77e);
            cVar86 = -(cStack_78d < cStack_77d);
            cVar88 = -(cStack_78c < cStack_77c);
            cVar89 = -(cStack_78b < cStack_77b);
            cVar91 = -(cStack_78a < cStack_77a);
            cVar92 = -(cStack_789 < cStack_779);
            auVar38[1] = cVar69;
            auVar38[0] = cVar68;
            auVar38[2] = cVar73;
            auVar38[3] = cVar74;
            auVar38[4] = cVar76;
            auVar38[5] = cVar77;
            auVar38[6] = cVar79;
            auVar38[7] = cVar80;
            auVar38[9] = cVar83;
            auVar38[8] = cVar82;
            auVar38[10] = cVar85;
            auVar38[0xb] = cVar86;
            auVar38[0xc] = cVar88;
            auVar38[0xd] = cVar89;
            auVar38[0xe] = cVar91;
            auVar38[0xf] = cVar92;
            auVar71 = pblendvb((undefined1  [16])alVar125,auVar118,auVar38);
            auVar37[1] = cVar69;
            auVar37[0] = cVar68;
            auVar37[2] = cVar73;
            auVar37[3] = cVar74;
            auVar37[4] = cVar76;
            auVar37[5] = cVar77;
            auVar37[6] = cVar79;
            auVar37[7] = cVar80;
            auVar37[9] = cVar83;
            auVar37[8] = cVar82;
            auVar37[10] = cVar85;
            auVar37[0xb] = cVar86;
            auVar37[0xc] = cVar88;
            auVar37[0xd] = cVar89;
            auVar37[0xe] = cVar91;
            auVar37[0xf] = cVar92;
            auVar122 = pblendvb((undefined1  [16])alVar126,auVar119,auVar37);
            auVar123._8_8_ = 0x101010101010101;
            auVar123._0_8_ = 0x101010101010101;
            auVar123 = paddsb((undefined1  [16])alVar127,auVar123);
            auVar121._8_8_ = 0x101010101010101;
            auVar121._0_8_ = 0x101010101010101;
            auVar121 = paddsb(auVar120,auVar121);
            auVar36[1] = cVar69;
            auVar36[0] = cVar68;
            auVar36[2] = cVar73;
            auVar36[3] = cVar74;
            auVar36[4] = cVar76;
            auVar36[5] = cVar77;
            auVar36[6] = cVar79;
            auVar36[7] = cVar80;
            auVar36[9] = cVar83;
            auVar36[8] = cVar82;
            auVar36[10] = cVar85;
            auVar36[0xb] = cVar86;
            auVar36[0xc] = cVar88;
            auVar36[0xd] = cVar89;
            auVar36[0xe] = cVar91;
            auVar36[0xf] = cVar92;
            auVar121 = pblendvb(auVar123,auVar121,auVar36);
            ptr[k][0] = vE_ext[1];
            ptr[k][1] = vE[0];
            vES[1] = auVar71._0_8_;
            vEM[0] = auVar71._8_8_;
            b[k][0] = vES[1];
            b[k][1] = vEM[0];
            vEL[1] = auVar122._0_8_;
            vES[0] = auVar122._8_8_;
            b_00[k][0] = vEL[1];
            b_00[k][1] = vES[0];
            vF[1] = auVar121._0_8_;
            vEL[0] = auVar121._8_8_;
            b_01[k][0] = vF[1];
            b_01[k][1] = vEL[0];
            auVar50._8_8_ = vF[0];
            auVar50._0_8_ = vF_ext[1];
            auVar49._8_8_ = uVar15;
            auVar49._0_8_ = uVar12;
            auVar71 = psubsb(auVar50,auVar49);
            local_7b8 = auVar71[0];
            cStack_7b7 = auVar71[1];
            cStack_7b6 = auVar71[2];
            cStack_7b5 = auVar71[3];
            cStack_7b4 = auVar71[4];
            cStack_7b3 = auVar71[5];
            cStack_7b2 = auVar71[6];
            cStack_7b1 = auVar71[7];
            cStack_7b0 = auVar71[8];
            cStack_7af = auVar71[9];
            cStack_7ae = auVar71[10];
            cStack_7ad = auVar71[0xb];
            cStack_7ac = auVar71[0xc];
            cStack_7ab = auVar71[0xd];
            cStack_7aa = auVar71[0xe];
            cStack_7a9 = auVar71[0xf];
            vF_ext[1] = CONCAT17((cStack_781 < cStack_7b1) * cStack_7b1 |
                                 (cStack_781 >= cStack_7b1) * cStack_781,
                                 CONCAT16((cStack_782 < cStack_7b2) * cStack_7b2 |
                                          (cStack_782 >= cStack_7b2) * cStack_782,
                                          CONCAT15((cStack_783 < cStack_7b3) * cStack_7b3 |
                                                   (cStack_783 >= cStack_7b3) * cStack_783,
                                                   CONCAT14((cStack_784 < cStack_7b4) * cStack_7b4 |
                                                            (cStack_784 >= cStack_7b4) * cStack_784,
                                                            CONCAT13((cStack_785 < cStack_7b5) *
                                                                     cStack_7b5 |
                                                                     (cStack_785 >= cStack_7b5) *
                                                                     cStack_785,
                                                                     CONCAT12((cStack_786 <
                                                                              cStack_7b6) *
                                                                              cStack_7b6 |
                                                                              (cStack_786 >=
                                                                              cStack_7b6) *
                                                                              cStack_786,
                                                                              CONCAT11((cStack_787 <
                                                                                       cStack_7b7) *
                                                                                       cStack_7b7 |
                                                                                       (cStack_787
                                                                                       >= cStack_7b7
                                                                                       ) * 
                                                  cStack_787,
                                                  (local_788 < local_7b8) * local_7b8 |
                                                  (local_788 >= local_7b8) * local_788)))))));
            vF[0] = CONCAT17((cStack_779 < cStack_7a9) * cStack_7a9 |
                             (cStack_779 >= cStack_7a9) * cStack_779,
                             CONCAT16((cStack_77a < cStack_7aa) * cStack_7aa |
                                      (cStack_77a >= cStack_7aa) * cStack_77a,
                                      CONCAT15((cStack_77b < cStack_7ab) * cStack_7ab |
                                               (cStack_77b >= cStack_7ab) * cStack_77b,
                                               CONCAT14((cStack_77c < cStack_7ac) * cStack_7ac |
                                                        (cStack_77c >= cStack_7ac) * cStack_77c,
                                                        CONCAT13((cStack_77d < cStack_7ad) *
                                                                 cStack_7ad |
                                                                 (cStack_77d >= cStack_7ad) *
                                                                 cStack_77d,
                                                                 CONCAT12((cStack_77e < cStack_7ae)
                                                                          * cStack_7ae |
                                                                          (cStack_77e >= cStack_7ae)
                                                                          * cStack_77e,
                                                                          CONCAT11((cStack_77f <
                                                                                   cStack_7af) *
                                                                                   cStack_7af |
                                                                                   (cStack_77f >=
                                                                                   cStack_7af) *
                                                                                   cStack_77f,
                                                                                   (cStack_780 <
                                                                                   cStack_7b0) *
                                                                                   cStack_7b0 |
                                                                                   (cStack_780 >=
                                                                                   cStack_7b0) *
                                                                                   cStack_780)))))))
            ;
            cVar68 = -(local_7b8 < local_788);
            cVar69 = -(cStack_7b7 < cStack_787);
            cVar73 = -(cStack_7b6 < cStack_786);
            cVar74 = -(cStack_7b5 < cStack_785);
            cVar76 = -(cStack_7b4 < cStack_784);
            cVar77 = -(cStack_7b3 < cStack_783);
            cVar79 = -(cStack_7b2 < cStack_782);
            cVar80 = -(cStack_7b1 < cStack_781);
            cVar82 = -(cStack_7b0 < cStack_780);
            cVar83 = -(cStack_7af < cStack_77f);
            cVar85 = -(cStack_7ae < cStack_77e);
            cVar86 = -(cStack_7ad < cStack_77d);
            cVar88 = -(cStack_7ac < cStack_77c);
            cVar89 = -(cStack_7ab < cStack_77b);
            cVar91 = -(cStack_7aa < cStack_77a);
            cVar92 = -(cStack_7a9 < cStack_779);
            auVar35[1] = cVar69;
            auVar35[0] = cVar68;
            auVar35[2] = cVar73;
            auVar35[3] = cVar74;
            auVar35[4] = cVar76;
            auVar35[5] = cVar77;
            auVar35[6] = cVar79;
            auVar35[7] = cVar80;
            auVar35[9] = cVar83;
            auVar35[8] = cVar82;
            auVar35[10] = cVar85;
            auVar35[0xb] = cVar86;
            auVar35[0xc] = cVar88;
            auVar35[0xd] = cVar89;
            auVar35[0xe] = cVar91;
            auVar35[0xf] = cVar92;
            register0x00001240 = pblendvb(stack0xffffffffffffef48,auVar118,auVar35);
            auVar34[1] = cVar69;
            auVar34[0] = cVar68;
            auVar34[2] = cVar73;
            auVar34[3] = cVar74;
            auVar34[4] = cVar76;
            auVar34[5] = cVar77;
            auVar34[6] = cVar79;
            auVar34[7] = cVar80;
            auVar34[9] = cVar83;
            auVar34[8] = cVar82;
            auVar34[10] = cVar85;
            auVar34[0xb] = cVar86;
            auVar34[0xc] = cVar88;
            auVar34[0xd] = cVar89;
            auVar34[0xe] = cVar91;
            auVar34[0xf] = cVar92;
            register0x00001240 = pblendvb(stack0xffffffffffffef38,auVar119,auVar34);
            auVar122._8_8_ = 0x101010101010101;
            auVar122._0_8_ = 0x101010101010101;
            auVar122 = paddsb(stack0xffffffffffffef28,auVar122);
            auVar71._8_8_ = 0x101010101010101;
            auVar71._0_8_ = 0x101010101010101;
            auVar71 = paddsb(auVar120,auVar71);
            auVar119[1] = cVar69;
            auVar119[0] = cVar68;
            auVar119[2] = cVar73;
            auVar119[3] = cVar74;
            auVar119[4] = cVar76;
            auVar119[5] = cVar77;
            auVar119[6] = cVar79;
            auVar119[7] = cVar80;
            auVar119[9] = cVar83;
            auVar119[8] = cVar82;
            auVar119[10] = cVar85;
            auVar119[0xb] = cVar86;
            auVar119[0xc] = cVar88;
            auVar119[0xd] = cVar89;
            auVar119[0xe] = cVar91;
            auVar119[0xf] = cVar92;
            register0x00001240 = pblendvb(auVar122,auVar71,auVar119);
            vH_dag[1] = pvHLoad[k][0];
            vH[0] = pvHLoad[k][1];
            unique0x10006f6d = pvHMLoad[k];
            unique0x10006f7d = pvHSLoad[k];
            _vP = pvHLLoad[k];
          }
          for (end_query = 0; end_query < 0x10; end_query = end_query + 1) {
            uVar70 = pvHLoad[iVar60 + -1][0];
            if (s2_beg == 0) {
              local_128c = ptr_00[s1Len + 1] - open;
            }
            else {
              local_128c = -open;
            }
            local_1298 = (ulong)local_128c;
            if ((long)local_1298 < -0x80) {
              local_1298 = 0xffffffffffffff80;
            }
            vF[0] = vF[0] << 8 | (ulong)vF_ext[1] >> 0x38;
            vFM[0] = vFM[0] << 8 | (ulong)vFS[1] >> 0x38;
            vFS[1] = vFS[1] << 8;
            vFS[0] = vFS[0] << 8 | (ulong)vFL[1] >> 0x38;
            vFL[1] = vFL[1] << 8;
            vHp[0] = pvHLoad[iVar60 + -1][1] << 8 | uVar70 >> 0x38;
            tmp_6 = uVar70 << 8 | (ulong)(byte)ptr_00[s1Len];
            vF_ext[1] = vF_ext[1] << 8 | local_1298 & 0xff;
            vFL[0] = vFL[0] << 8 | (ulong)vH[1] >> 0x38;
            vH[1] = vH[1] << 8 | 1;
            for (k = 0; k < iVar60; k = k + 1) {
              auVar71 = paddsb((undefined1  [16])_tmp_6,
                               *(undefined1 (*) [16])
                                ((long)pvVar4 + (long)k * 0x10 + (long)iVar65 * 0x10));
              lVar19 = pvHMStore[k][0];
              lVar20 = pvHMStore[k][1];
              local_7c8 = (char)lVar19;
              cStack_7c7 = (char)((ulong)lVar19 >> 8);
              cStack_7c6 = (char)((ulong)lVar19 >> 0x10);
              cStack_7c5 = (char)((ulong)lVar19 >> 0x18);
              cStack_7c4 = (char)((ulong)lVar19 >> 0x20);
              cStack_7c3 = (char)((ulong)lVar19 >> 0x28);
              cStack_7c2 = (char)((ulong)lVar19 >> 0x30);
              cStack_7c1 = (char)((ulong)lVar19 >> 0x38);
              cStack_7c0 = (char)lVar20;
              cStack_7bf = (char)((ulong)lVar20 >> 8);
              cStack_7be = (char)((ulong)lVar20 >> 0x10);
              cStack_7bd = (char)((ulong)lVar20 >> 0x18);
              cStack_7bc = (char)((ulong)lVar20 >> 0x20);
              cStack_7bb = (char)((ulong)lVar20 >> 0x28);
              cStack_7ba = (char)((ulong)lVar20 >> 0x30);
              cStack_7b9 = (char)((ulong)lVar20 >> 0x38);
              local_7d8 = (byte)vF_ext[1];
              bStack_7d7 = (byte)((ulong)vF_ext[1] >> 8);
              bStack_7d6 = (byte)((ulong)vF_ext[1] >> 0x10);
              bStack_7d5 = (byte)((ulong)vF_ext[1] >> 0x18);
              bStack_7d4 = (byte)((ulong)vF_ext[1] >> 0x20);
              bStack_7d3 = (byte)((ulong)vF_ext[1] >> 0x28);
              bStack_7d2 = (byte)((ulong)vF_ext[1] >> 0x30);
              bStack_7d1 = (byte)((ulong)vF_ext[1] >> 0x38);
              bStack_7d0 = (byte)vF[0];
              bStack_7cf = (byte)((ulong)vF[0] >> 8);
              bStack_7ce = (byte)((ulong)vF[0] >> 0x10);
              bStack_7cd = (byte)((ulong)vF[0] >> 0x18);
              bStack_7cc = (byte)((ulong)vF[0] >> 0x20);
              bStack_7cb = (byte)((ulong)vF[0] >> 0x28);
              bStack_7ca = (byte)((ulong)vF[0] >> 0x30);
              bStack_7c9 = (byte)((ulong)vF[0] >> 0x38);
              bVar67 = (local_7c8 < (char)local_7d8) * local_7d8 |
                       (local_7c8 >= (char)local_7d8) * local_7c8;
              bVar72 = (cStack_7c7 < (char)bStack_7d7) * bStack_7d7 |
                       (cStack_7c7 >= (char)bStack_7d7) * cStack_7c7;
              bVar75 = (cStack_7c6 < (char)bStack_7d6) * bStack_7d6 |
                       (cStack_7c6 >= (char)bStack_7d6) * cStack_7c6;
              bVar78 = (cStack_7c5 < (char)bStack_7d5) * bStack_7d5 |
                       (cStack_7c5 >= (char)bStack_7d5) * cStack_7c5;
              bVar81 = (cStack_7c4 < (char)bStack_7d4) * bStack_7d4 |
                       (cStack_7c4 >= (char)bStack_7d4) * cStack_7c4;
              bVar84 = (cStack_7c3 < (char)bStack_7d3) * bStack_7d3 |
                       (cStack_7c3 >= (char)bStack_7d3) * cStack_7c3;
              bVar87 = (cStack_7c2 < (char)bStack_7d2) * bStack_7d2 |
                       (cStack_7c2 >= (char)bStack_7d2) * cStack_7c2;
              bVar90 = (cStack_7c1 < (char)bStack_7d1) * bStack_7d1 |
                       (cStack_7c1 >= (char)bStack_7d1) * cStack_7c1;
              bVar93 = (cStack_7c0 < (char)bStack_7d0) * bStack_7d0 |
                       (cStack_7c0 >= (char)bStack_7d0) * cStack_7c0;
              bVar97 = (cStack_7bf < (char)bStack_7cf) * bStack_7cf |
                       (cStack_7bf >= (char)bStack_7cf) * cStack_7bf;
              bVar100 = (cStack_7be < (char)bStack_7ce) * bStack_7ce |
                        (cStack_7be >= (char)bStack_7ce) * cStack_7be;
              bVar103 = (cStack_7bd < (char)bStack_7cd) * bStack_7cd |
                        (cStack_7bd >= (char)bStack_7cd) * cStack_7bd;
              bVar106 = (cStack_7bc < (char)bStack_7cc) * bStack_7cc |
                        (cStack_7bc >= (char)bStack_7cc) * cStack_7bc;
              bVar109 = (cStack_7bb < (char)bStack_7cb) * bStack_7cb |
                        (cStack_7bb >= (char)bStack_7cb) * cStack_7bb;
              bVar112 = (cStack_7ba < (char)bStack_7ca) * bStack_7ca |
                        (cStack_7ba >= (char)bStack_7ca) * cStack_7ba;
              bVar115 = (cStack_7b9 < (char)bStack_7c9) * bStack_7c9 |
                        (cStack_7b9 >= (char)bStack_7c9) * cStack_7b9;
              vH_dag[1]._0_2_ = CONCAT11(bVar72,bVar67);
              vH_dag[1]._0_3_ = CONCAT12(bVar75,(undefined2)vH_dag[1]);
              vH_dag[1]._0_4_ = CONCAT13(bVar78,(undefined3)vH_dag[1]);
              vH_dag[1]._0_5_ = CONCAT14(bVar81,(undefined4)vH_dag[1]);
              vH_dag[1]._0_6_ = CONCAT15(bVar84,(undefined5)vH_dag[1]);
              vH_dag[1]._0_7_ = CONCAT16(bVar87,(undefined6)vH_dag[1]);
              vH_dag[1] = CONCAT17(bVar90,(undefined7)vH_dag[1]);
              vH[0]._0_2_ = CONCAT11(bVar97,bVar93);
              vH[0]._0_3_ = CONCAT12(bVar100,(undefined2)vH[0]);
              vH[0]._0_4_ = CONCAT13(bVar103,(undefined3)vH[0]);
              vH[0]._0_5_ = CONCAT14(bVar106,(undefined4)vH[0]);
              vH[0]._0_6_ = CONCAT15(bVar109,(undefined5)vH[0]);
              vH[0]._0_7_ = CONCAT16(bVar112,(undefined6)vH[0]);
              vH[0] = CONCAT17(bVar115,(undefined7)vH[0]);
              pvHMStore[k][0] = vH_dag[1];
              pvHMStore[k][1] = vH[0];
              local_dc8 = auVar71[0];
              bStack_dc7 = auVar71[1];
              bStack_dc6 = auVar71[2];
              bStack_dc5 = auVar71[3];
              bStack_dc4 = auVar71[4];
              bStack_dc3 = auVar71[5];
              bStack_dc2 = auVar71[6];
              bStack_dc1 = auVar71[7];
              bStack_dc0 = auVar71[8];
              bStack_dbf = auVar71[9];
              bStack_dbe = auVar71[10];
              bStack_dbd = auVar71[0xb];
              bStack_dbc = auVar71[0xc];
              bStack_dbb = auVar71[0xd];
              bStack_dba = auVar71[0xe];
              bStack_db9 = auVar71[0xf];
              uVar70 = ~CONCAT17(-(bVar90 == bStack_dc1),
                                 CONCAT16(-(bVar87 == bStack_dc2),
                                          CONCAT15(-(bVar84 == bStack_dc3),
                                                   CONCAT14(-(bVar81 == bStack_dc4),
                                                            CONCAT13(-(bVar78 == bStack_dc5),
                                                                     CONCAT12(-(bVar75 == bStack_dc6
                                                                               ),CONCAT11(-(bVar72 
                                                  == bStack_dc7),-(bVar67 == local_dc8)))))))) &
                       CONCAT17(-(bVar90 == bStack_7d1),
                                CONCAT16(-(bVar87 == bStack_7d2),
                                         CONCAT15(-(bVar84 == bStack_7d3),
                                                  CONCAT14(-(bVar81 == bStack_7d4),
                                                           CONCAT13(-(bVar78 == bStack_7d5),
                                                                    CONCAT12(-(bVar75 == bStack_7d6)
                                                                             ,CONCAT11(-(bVar72 ==
                                                                                        bStack_7d7),
                                                                                       -(bVar67 ==
                                                                                        local_7d8)))
                                                                   )))));
              uVar96 = ~CONCAT17(-(bVar115 == bStack_db9),
                                 CONCAT16(-(bVar112 == bStack_dba),
                                          CONCAT15(-(bVar109 == bStack_dbb),
                                                   CONCAT14(-(bVar106 == bStack_dbc),
                                                            CONCAT13(-(bVar103 == bStack_dbd),
                                                                     CONCAT12(-(bVar100 ==
                                                                               bStack_dbe),
                                                                              CONCAT11(-(bVar97 ==
                                                                                        bStack_dbf),
                                                                                       -(bVar93 ==
                                                                                        bStack_dc0))
                                                                             )))))) &
                       CONCAT17(-(bVar115 == bStack_7c9),
                                CONCAT16(-(bVar112 == bStack_7ca),
                                         CONCAT15(-(bVar109 == bStack_7cb),
                                                  CONCAT14(-(bVar106 == bStack_7cc),
                                                           CONCAT13(-(bVar103 == bStack_7cd),
                                                                    CONCAT12(-(bVar100 == bStack_7ce
                                                                              ),CONCAT11(-(bVar97 ==
                                                                                          bStack_7cf
                                                                                          ),-(bVar93
                                                                                             == 
                                                  bStack_7d0))))))));
              auVar33._8_8_ = uVar96;
              auVar33._0_8_ = uVar70;
              auVar121 = pblendvb((undefined1  [16])pvHSStore[k],stack0xffffffffffffef48,auVar33);
              vHS[1] = auVar121._0_8_;
              vHM[0] = auVar121._8_8_;
              pvHSStore[k][0] = vHS[1];
              pvHSStore[k][1] = vHM[0];
              auVar32._8_8_ = uVar96;
              auVar32._0_8_ = uVar70;
              auVar123 = pblendvb((undefined1  [16])pvHLStore[k],stack0xffffffffffffef38,auVar32);
              vHL[1] = auVar123._0_8_;
              vHS[0] = auVar123._8_8_;
              pvHLStore[k][0] = vHL[1];
              pvHLStore[k][1] = vHS[0];
              auVar31._8_8_ = uVar96;
              auVar31._0_8_ = uVar70;
              auVar120 = pblendvb((undefined1  [16])pvE[k],stack0xffffffffffffef28,auVar31);
              vP = auVar120._0_8_;
              vHL[0] = auVar120._8_8_;
              pvE[k][0] = (longlong)vP;
              pvE[k][1] = vHL[0];
              local_288 = (char)vSaturationCheckMax[1];
              cStack_287 = (char)((ulong)vSaturationCheckMax[1] >> 8);
              cStack_286 = (char)((ulong)vSaturationCheckMax[1] >> 0x10);
              cStack_285 = (char)((ulong)vSaturationCheckMax[1] >> 0x18);
              cStack_284 = (char)((ulong)vSaturationCheckMax[1] >> 0x20);
              cStack_283 = (char)((ulong)vSaturationCheckMax[1] >> 0x28);
              cStack_282 = (char)((ulong)vSaturationCheckMax[1] >> 0x30);
              cStack_281 = (char)((ulong)vSaturationCheckMax[1] >> 0x38);
              cStack_280 = (char)vSaturationCheckMin[0];
              cStack_27f = (char)((ulong)vSaturationCheckMin[0] >> 8);
              cStack_27e = (char)((ulong)vSaturationCheckMin[0] >> 0x10);
              cStack_27d = (char)((ulong)vSaturationCheckMin[0] >> 0x18);
              cStack_27c = (char)((ulong)vSaturationCheckMin[0] >> 0x20);
              cStack_27b = (char)((ulong)vSaturationCheckMin[0] >> 0x28);
              cStack_27a = (char)((ulong)vSaturationCheckMin[0] >> 0x30);
              cStack_279 = (char)((ulong)vSaturationCheckMin[0] >> 0x38);
              vSaturationCheckMax[1]._0_2_ =
                   CONCAT11(((char)bVar72 < cStack_287) * bVar72 |
                            ((char)bVar72 >= cStack_287) * cStack_287,
                            ((char)bVar67 < local_288) * bVar67 |
                            ((char)bVar67 >= local_288) * local_288);
              vSaturationCheckMax[1]._0_3_ =
                   CONCAT12(((char)bVar75 < cStack_286) * bVar75 |
                            ((char)bVar75 >= cStack_286) * cStack_286,
                            (undefined2)vSaturationCheckMax[1]);
              vSaturationCheckMax[1]._0_4_ =
                   CONCAT13(((char)bVar78 < cStack_285) * bVar78 |
                            ((char)bVar78 >= cStack_285) * cStack_285,
                            (undefined3)vSaturationCheckMax[1]);
              vSaturationCheckMax[1]._0_5_ =
                   CONCAT14(((char)bVar81 < cStack_284) * bVar81 |
                            ((char)bVar81 >= cStack_284) * cStack_284,
                            (undefined4)vSaturationCheckMax[1]);
              vSaturationCheckMax[1]._0_6_ =
                   CONCAT15(((char)bVar84 < cStack_283) * bVar84 |
                            ((char)bVar84 >= cStack_283) * cStack_283,
                            (undefined5)vSaturationCheckMax[1]);
              vSaturationCheckMax[1]._0_7_ =
                   CONCAT16(((char)bVar87 < cStack_282) * bVar87 |
                            ((char)bVar87 >= cStack_282) * cStack_282,
                            (undefined6)vSaturationCheckMax[1]);
              vSaturationCheckMax[1] =
                   CONCAT17(((char)bVar90 < cStack_281) * bVar90 |
                            ((char)bVar90 >= cStack_281) * cStack_281,
                            (undefined7)vSaturationCheckMax[1]);
              vSaturationCheckMin[0]._0_2_ =
                   CONCAT11(((char)bVar97 < cStack_27f) * bVar97 |
                            ((char)bVar97 >= cStack_27f) * cStack_27f,
                            ((char)bVar93 < cStack_280) * bVar93 |
                            ((char)bVar93 >= cStack_280) * cStack_280);
              vSaturationCheckMin[0]._0_3_ =
                   CONCAT12(((char)bVar100 < cStack_27e) * bVar100 |
                            ((char)bVar100 >= cStack_27e) * cStack_27e,
                            (undefined2)vSaturationCheckMin[0]);
              vSaturationCheckMin[0]._0_4_ =
                   CONCAT13(((char)bVar103 < cStack_27d) * bVar103 |
                            ((char)bVar103 >= cStack_27d) * cStack_27d,
                            (undefined3)vSaturationCheckMin[0]);
              vSaturationCheckMin[0]._0_5_ =
                   CONCAT14(((char)bVar106 < cStack_27c) * bVar106 |
                            ((char)bVar106 >= cStack_27c) * cStack_27c,
                            (undefined4)vSaturationCheckMin[0]);
              vSaturationCheckMin[0]._0_6_ =
                   CONCAT15(((char)bVar109 < cStack_27b) * bVar109 |
                            ((char)bVar109 >= cStack_27b) * cStack_27b,
                            (undefined5)vSaturationCheckMin[0]);
              vSaturationCheckMin[0]._0_7_ =
                   CONCAT16(((char)bVar112 < cStack_27a) * bVar112 |
                            ((char)bVar112 >= cStack_27a) * cStack_27a,
                            (undefined6)vSaturationCheckMin[0]);
              vSaturationCheckMin[0] =
                   CONCAT17(((char)bVar115 < cStack_279) * bVar115 |
                            ((char)bVar115 >= cStack_279) * cStack_279,
                            (undefined7)vSaturationCheckMin[0]);
              local_7e8 = (char)vMaxH[1];
              cStack_7e7 = (char)((ulong)vMaxH[1] >> 8);
              cStack_7e6 = (char)((ulong)vMaxH[1] >> 0x10);
              cStack_7e5 = (char)((ulong)vMaxH[1] >> 0x18);
              cStack_7e4 = (char)((ulong)vMaxH[1] >> 0x20);
              cStack_7e3 = (char)((ulong)vMaxH[1] >> 0x28);
              cStack_7e2 = (char)((ulong)vMaxH[1] >> 0x30);
              cStack_7e1 = (char)((ulong)vMaxH[1] >> 0x38);
              cStack_7e0 = (char)vSaturationCheckMax[0];
              cStack_7df = (char)((ulong)vSaturationCheckMax[0] >> 8);
              cStack_7de = (char)((ulong)vSaturationCheckMax[0] >> 0x10);
              cStack_7dd = (char)((ulong)vSaturationCheckMax[0] >> 0x18);
              cStack_7dc = (char)((ulong)vSaturationCheckMax[0] >> 0x20);
              cStack_7db = (char)((ulong)vSaturationCheckMax[0] >> 0x28);
              cStack_7da = (char)((ulong)vSaturationCheckMax[0] >> 0x30);
              cStack_7d9 = (char)((ulong)vSaturationCheckMax[0] >> 0x38);
              bVar67 = (local_7e8 < (char)bVar67) * bVar67 | (local_7e8 >= (char)bVar67) * local_7e8
              ;
              bVar72 = (cStack_7e7 < (char)bVar72) * bVar72 |
                       (cStack_7e7 >= (char)bVar72) * cStack_7e7;
              bVar75 = (cStack_7e6 < (char)bVar75) * bVar75 |
                       (cStack_7e6 >= (char)bVar75) * cStack_7e6;
              bVar78 = (cStack_7e5 < (char)bVar78) * bVar78 |
                       (cStack_7e5 >= (char)bVar78) * cStack_7e5;
              bVar81 = (cStack_7e4 < (char)bVar81) * bVar81 |
                       (cStack_7e4 >= (char)bVar81) * cStack_7e4;
              bVar84 = (cStack_7e3 < (char)bVar84) * bVar84 |
                       (cStack_7e3 >= (char)bVar84) * cStack_7e3;
              bVar87 = (cStack_7e2 < (char)bVar87) * bVar87 |
                       (cStack_7e2 >= (char)bVar87) * cStack_7e2;
              bVar90 = (cStack_7e1 < (char)bVar90) * bVar90 |
                       (cStack_7e1 >= (char)bVar90) * cStack_7e1;
              bVar93 = (cStack_7e0 < (char)bVar93) * bVar93 |
                       (cStack_7e0 >= (char)bVar93) * cStack_7e0;
              bVar97 = (cStack_7df < (char)bVar97) * bVar97 |
                       (cStack_7df >= (char)bVar97) * cStack_7df;
              bVar100 = (cStack_7de < (char)bVar100) * bVar100 |
                        (cStack_7de >= (char)bVar100) * cStack_7de;
              bVar103 = (cStack_7dd < (char)bVar103) * bVar103 |
                        (cStack_7dd >= (char)bVar103) * cStack_7dd;
              bVar106 = (cStack_7dc < (char)bVar106) * bVar106 |
                        (cStack_7dc >= (char)bVar106) * cStack_7dc;
              bVar109 = (cStack_7db < (char)bVar109) * bVar109 |
                        (cStack_7db >= (char)bVar109) * cStack_7db;
              bVar112 = (cStack_7da < (char)bVar112) * bVar112 |
                        (cStack_7da >= (char)bVar112) * cStack_7da;
              bVar115 = (cStack_7d9 < (char)bVar115) * bVar115 |
                        (cStack_7d9 >= (char)bVar115) * cStack_7d9;
              local_818 = auVar121[0];
              cStack_817 = auVar121[1];
              cStack_816 = auVar121[2];
              cStack_815 = auVar121[3];
              cStack_814 = auVar121[4];
              cStack_813 = auVar121[5];
              cStack_812 = auVar121[6];
              cStack_811 = auVar121[7];
              cStack_810 = auVar121[8];
              cStack_80f = auVar121[9];
              cStack_80e = auVar121[10];
              cStack_80d = auVar121[0xb];
              cStack_80c = auVar121[0xc];
              cStack_80b = auVar121[0xd];
              cStack_80a = auVar121[0xe];
              cStack_809 = auVar121[0xf];
              bVar67 = ((char)bVar67 < local_818) * local_818 | ((char)bVar67 >= local_818) * bVar67
              ;
              bVar72 = ((char)bVar72 < cStack_817) * cStack_817 |
                       ((char)bVar72 >= cStack_817) * bVar72;
              bVar75 = ((char)bVar75 < cStack_816) * cStack_816 |
                       ((char)bVar75 >= cStack_816) * bVar75;
              bVar78 = ((char)bVar78 < cStack_815) * cStack_815 |
                       ((char)bVar78 >= cStack_815) * bVar78;
              bVar81 = ((char)bVar81 < cStack_814) * cStack_814 |
                       ((char)bVar81 >= cStack_814) * bVar81;
              bVar84 = ((char)bVar84 < cStack_813) * cStack_813 |
                       ((char)bVar84 >= cStack_813) * bVar84;
              bVar87 = ((char)bVar87 < cStack_812) * cStack_812 |
                       ((char)bVar87 >= cStack_812) * bVar87;
              bVar90 = ((char)bVar90 < cStack_811) * cStack_811 |
                       ((char)bVar90 >= cStack_811) * bVar90;
              bVar93 = ((char)bVar93 < cStack_810) * cStack_810 |
                       ((char)bVar93 >= cStack_810) * bVar93;
              bVar97 = ((char)bVar97 < cStack_80f) * cStack_80f |
                       ((char)bVar97 >= cStack_80f) * bVar97;
              bVar100 = ((char)bVar100 < cStack_80e) * cStack_80e |
                        ((char)bVar100 >= cStack_80e) * bVar100;
              bVar103 = ((char)bVar103 < cStack_80d) * cStack_80d |
                        ((char)bVar103 >= cStack_80d) * bVar103;
              bVar106 = ((char)bVar106 < cStack_80c) * cStack_80c |
                        ((char)bVar106 >= cStack_80c) * bVar106;
              bVar109 = ((char)bVar109 < cStack_80b) * cStack_80b |
                        ((char)bVar109 >= cStack_80b) * bVar109;
              bVar112 = ((char)bVar112 < cStack_80a) * cStack_80a |
                        ((char)bVar112 >= cStack_80a) * bVar112;
              bVar115 = ((char)bVar115 < cStack_809) * cStack_809 |
                        ((char)bVar115 >= cStack_809) * bVar115;
              local_838 = auVar123[0];
              cStack_837 = auVar123[1];
              cStack_836 = auVar123[2];
              cStack_835 = auVar123[3];
              cStack_834 = auVar123[4];
              cStack_833 = auVar123[5];
              cStack_832 = auVar123[6];
              cStack_831 = auVar123[7];
              cStack_830 = auVar123[8];
              cStack_82f = auVar123[9];
              cStack_82e = auVar123[10];
              cStack_82d = auVar123[0xb];
              cStack_82c = auVar123[0xc];
              cStack_82b = auVar123[0xd];
              cStack_82a = auVar123[0xe];
              cStack_829 = auVar123[0xf];
              bVar67 = ((char)bVar67 < local_838) * local_838 | ((char)bVar67 >= local_838) * bVar67
              ;
              bVar72 = ((char)bVar72 < cStack_837) * cStack_837 |
                       ((char)bVar72 >= cStack_837) * bVar72;
              bVar75 = ((char)bVar75 < cStack_836) * cStack_836 |
                       ((char)bVar75 >= cStack_836) * bVar75;
              bVar78 = ((char)bVar78 < cStack_835) * cStack_835 |
                       ((char)bVar78 >= cStack_835) * bVar78;
              bVar81 = ((char)bVar81 < cStack_834) * cStack_834 |
                       ((char)bVar81 >= cStack_834) * bVar81;
              bVar84 = ((char)bVar84 < cStack_833) * cStack_833 |
                       ((char)bVar84 >= cStack_833) * bVar84;
              bVar87 = ((char)bVar87 < cStack_832) * cStack_832 |
                       ((char)bVar87 >= cStack_832) * bVar87;
              bVar90 = ((char)bVar90 < cStack_831) * cStack_831 |
                       ((char)bVar90 >= cStack_831) * bVar90;
              bVar93 = ((char)bVar93 < cStack_830) * cStack_830 |
                       ((char)bVar93 >= cStack_830) * bVar93;
              bVar97 = ((char)bVar97 < cStack_82f) * cStack_82f |
                       ((char)bVar97 >= cStack_82f) * bVar97;
              bVar100 = ((char)bVar100 < cStack_82e) * cStack_82e |
                        ((char)bVar100 >= cStack_82e) * bVar100;
              bVar103 = ((char)bVar103 < cStack_82d) * cStack_82d |
                        ((char)bVar103 >= cStack_82d) * bVar103;
              bVar106 = ((char)bVar106 < cStack_82c) * cStack_82c |
                        ((char)bVar106 >= cStack_82c) * bVar106;
              bVar109 = ((char)bVar109 < cStack_82b) * cStack_82b |
                        ((char)bVar109 >= cStack_82b) * bVar109;
              bVar112 = ((char)bVar112 < cStack_82a) * cStack_82a |
                        ((char)bVar112 >= cStack_82a) * bVar112;
              bVar115 = ((char)bVar115 < cStack_829) * cStack_829 |
                        ((char)bVar115 >= cStack_829) * bVar115;
              local_858 = auVar120[0];
              cStack_857 = auVar120[1];
              cStack_856 = auVar120[2];
              cStack_855 = auVar120[3];
              cStack_854 = auVar120[4];
              cStack_853 = auVar120[5];
              cStack_852 = auVar120[6];
              cStack_851 = auVar120[7];
              cStack_850 = auVar120[8];
              cStack_84f = auVar120[9];
              cStack_84e = auVar120[10];
              cStack_84d = auVar120[0xb];
              cStack_84c = auVar120[0xc];
              cStack_84b = auVar120[0xd];
              cStack_84a = auVar120[0xe];
              cStack_849 = auVar120[0xf];
              vMaxH[1]._0_2_ =
                   CONCAT11(((char)bVar72 < cStack_857) * cStack_857 |
                            ((char)bVar72 >= cStack_857) * bVar72,
                            ((char)bVar67 < local_858) * local_858 |
                            ((char)bVar67 >= local_858) * bVar67);
              vMaxH[1]._0_3_ =
                   CONCAT12(((char)bVar75 < cStack_856) * cStack_856 |
                            ((char)bVar75 >= cStack_856) * bVar75,(undefined2)vMaxH[1]);
              vMaxH[1]._0_4_ =
                   CONCAT13(((char)bVar78 < cStack_855) * cStack_855 |
                            ((char)bVar78 >= cStack_855) * bVar78,(undefined3)vMaxH[1]);
              vMaxH[1]._0_5_ =
                   CONCAT14(((char)bVar81 < cStack_854) * cStack_854 |
                            ((char)bVar81 >= cStack_854) * bVar81,(undefined4)vMaxH[1]);
              vMaxH[1]._0_6_ =
                   CONCAT15(((char)bVar84 < cStack_853) * cStack_853 |
                            ((char)bVar84 >= cStack_853) * bVar84,(undefined5)vMaxH[1]);
              vMaxH[1]._0_7_ =
                   CONCAT16(((char)bVar87 < cStack_852) * cStack_852 |
                            ((char)bVar87 >= cStack_852) * bVar87,(undefined6)vMaxH[1]);
              vMaxH[1] = CONCAT17(((char)bVar90 < cStack_851) * cStack_851 |
                                  ((char)bVar90 >= cStack_851) * bVar90,(undefined7)vMaxH[1]);
              vSaturationCheckMax[0]._0_2_ =
                   CONCAT11(((char)bVar97 < cStack_84f) * cStack_84f |
                            ((char)bVar97 >= cStack_84f) * bVar97,
                            ((char)bVar93 < cStack_850) * cStack_850 |
                            ((char)bVar93 >= cStack_850) * bVar93);
              vSaturationCheckMax[0]._0_3_ =
                   CONCAT12(((char)bVar100 < cStack_84e) * cStack_84e |
                            ((char)bVar100 >= cStack_84e) * bVar100,
                            (undefined2)vSaturationCheckMax[0]);
              vSaturationCheckMax[0]._0_4_ =
                   CONCAT13(((char)bVar103 < cStack_84d) * cStack_84d |
                            ((char)bVar103 >= cStack_84d) * bVar103,
                            (undefined3)vSaturationCheckMax[0]);
              vSaturationCheckMax[0]._0_5_ =
                   CONCAT14(((char)bVar106 < cStack_84c) * cStack_84c |
                            ((char)bVar106 >= cStack_84c) * bVar106,
                            (undefined4)vSaturationCheckMax[0]);
              vSaturationCheckMax[0]._0_6_ =
                   CONCAT15(((char)bVar109 < cStack_84b) * cStack_84b |
                            ((char)bVar109 >= cStack_84b) * bVar109,
                            (undefined5)vSaturationCheckMax[0]);
              vSaturationCheckMax[0]._0_7_ =
                   CONCAT16(((char)bVar112 < cStack_84a) * cStack_84a |
                            ((char)bVar112 >= cStack_84a) * bVar112,
                            (undefined6)vSaturationCheckMax[0]);
              vSaturationCheckMax[0] =
                   CONCAT17(((char)bVar115 < cStack_849) * cStack_849 |
                            ((char)bVar115 >= cStack_849) * bVar115,
                            (undefined7)vSaturationCheckMax[0]);
              auVar48._8_8_ = vH[0];
              auVar48._0_8_ = vH_dag[1];
              auVar47._8_8_ = uVar14;
              auVar47._0_8_ = uVar11;
              auVar71 = psubsb(auVar48,auVar47);
              auVar46._8_8_ = vF[0];
              auVar46._0_8_ = vF_ext[1];
              auVar45._8_8_ = uVar15;
              auVar45._0_8_ = uVar12;
              auVar122 = psubsb(auVar46,auVar45);
              vFM[1] = auVar122._0_8_;
              vF_ext[0] = auVar122._8_8_;
              local_148 = auVar122[0];
              cStack_147 = auVar122[1];
              cStack_146 = auVar122[2];
              cStack_145 = auVar122[3];
              cStack_144 = auVar122[4];
              cStack_143 = auVar122[5];
              cStack_142 = auVar122[6];
              cStack_141 = auVar122[7];
              cStack_140 = auVar122[8];
              cStack_13f = auVar122[9];
              cStack_13e = auVar122[10];
              cStack_13d = auVar122[0xb];
              cStack_13c = auVar122[0xc];
              cStack_13b = auVar122[0xd];
              cStack_13a = auVar122[0xe];
              cStack_139 = auVar122[0xf];
              local_158 = auVar71[0];
              cStack_157 = auVar71[1];
              cStack_156 = auVar71[2];
              cStack_155 = auVar71[3];
              cStack_154 = auVar71[4];
              cStack_153 = auVar71[5];
              cStack_152 = auVar71[6];
              cStack_151 = auVar71[7];
              cStack_150 = auVar71[8];
              cStack_14f = auVar71[9];
              cStack_14e = auVar71[10];
              cStack_14d = auVar71[0xb];
              cStack_14c = auVar71[0xc];
              cStack_14b = auVar71[0xd];
              cStack_14a = auVar71[0xe];
              cStack_149 = auVar71[0xf];
              uVar70 = CONCAT17(-(cStack_149 < cStack_139),
                                CONCAT16(-(cStack_14a < cStack_13a),
                                         CONCAT15(-(cStack_14b < cStack_13b),
                                                  CONCAT14(-(cStack_14c < cStack_13c),
                                                           CONCAT13(-(cStack_14d < cStack_13d),
                                                                    CONCAT12(-(cStack_14e <
                                                                              cStack_13e),
                                                                             CONCAT11(-(cStack_14f <
                                                                                       cStack_13f),
                                                                                      -(cStack_150 <
                                                                                       cStack_140)))
                                                                   ))))) |
                       CONCAT17(-(cStack_139 == cStack_149),
                                CONCAT16(-(cStack_13a == cStack_14a),
                                         CONCAT15(-(cStack_13b == cStack_14b),
                                                  CONCAT14(-(cStack_13c == cStack_14c),
                                                           CONCAT13(-(cStack_13d == cStack_14d),
                                                                    CONCAT12(-(cStack_13e ==
                                                                              cStack_14e),
                                                                             CONCAT11(-(cStack_13f
                                                                                       == cStack_14f
                                                                                       ),-(
                                                  cStack_140 == cStack_150))))))));
              auVar56._8_8_ = uVar70;
              auVar56._0_8_ =
                   CONCAT17(-(cStack_151 < cStack_141),
                            CONCAT16(-(cStack_152 < cStack_142),
                                     CONCAT15(-(cStack_153 < cStack_143),
                                              CONCAT14(-(cStack_154 < cStack_144),
                                                       CONCAT13(-(cStack_155 < cStack_145),
                                                                CONCAT12(-(cStack_156 < cStack_146),
                                                                         CONCAT11(-(cStack_157 <
                                                                                   cStack_147),
                                                                                  -(local_158 <
                                                                                   local_148))))))))
                   | CONCAT17(-(cStack_141 == cStack_151),
                              CONCAT16(-(cStack_142 == cStack_152),
                                       CONCAT15(-(cStack_143 == cStack_153),
                                                CONCAT14(-(cStack_144 == cStack_154),
                                                         CONCAT13(-(cStack_145 == cStack_155),
                                                                  CONCAT12(-(cStack_146 ==
                                                                            cStack_156),
                                                                           CONCAT11(-(cStack_147 ==
                                                                                     cStack_157),
                                                                                    -(local_148 ==
                                                                                     local_158))))))
                                      ));
              if ((((((((((((((((auVar56 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar56 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar56 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar56 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar56 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar56 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar56 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar56 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (uVar70 >> 7 & 1) == 0) && (uVar70 >> 0xf & 1) == 0) &&
                      (uVar70 >> 0x17 & 1) == 0) && (uVar70 >> 0x1f & 1) == 0) &&
                    (uVar70 >> 0x27 & 1) == 0) && (uVar70 >> 0x2f & 1) == 0) &&
                  (uVar70 >> 0x37 & 1) == 0) && -1 < (long)uVar70) goto LAB_0094f792;
              vF_ext[1] = vFM[1];
              vF[0] = vF_ext[0];
              cond_max[1] = CONCAT17(-(cStack_141 < cStack_151),
                                     CONCAT16(-(cStack_142 < cStack_152),
                                              CONCAT15(-(cStack_143 < cStack_153),
                                                       CONCAT14(-(cStack_144 < cStack_154),
                                                                CONCAT13(-(cStack_145 < cStack_155),
                                                                         CONCAT12(-(cStack_146 <
                                                                                   cStack_156),
                                                                                  CONCAT11(-(
                                                  cStack_147 < cStack_157),-(local_148 < local_158))
                                                  ))))));
              cond[0] = CONCAT17(-(cStack_139 < cStack_149),
                                 CONCAT16(-(cStack_13a < cStack_14a),
                                          CONCAT15(-(cStack_13b < cStack_14b),
                                                   CONCAT14(-(cStack_13c < cStack_14c),
                                                            CONCAT13(-(cStack_13d < cStack_14d),
                                                                     CONCAT12(-(cStack_13e <
                                                                               cStack_14e),
                                                                              CONCAT11(-(cStack_13f
                                                                                        < cStack_14f
                                                                                        ),-(
                                                  cStack_140 < cStack_150))))))));
              auVar30._8_8_ = cond[0];
              auVar30._0_8_ = cond_max[1];
              register0x00001240 = pblendvb(stack0xffffffffffffef48,auVar121,auVar30);
              auVar29._8_8_ = cond[0];
              auVar29._0_8_ = cond_max[1];
              register0x00001240 = pblendvb(stack0xffffffffffffef38,auVar123,auVar29);
              auVar23._8_8_ = 0x101010101010101;
              auVar23._0_8_ = 0x101010101010101;
              auVar122 = paddsb(stack0xffffffffffffef28,auVar23);
              auVar22._8_8_ = 0x101010101010101;
              auVar22._0_8_ = 0x101010101010101;
              auVar71 = paddsb(auVar120,auVar22);
              auVar28._8_8_ = cond[0];
              auVar28._0_8_ = cond_max[1];
              register0x00001240 = pblendvb(auVar122,auVar71,auVar28);
              _tmp_6 = pvHLoad[k];
            }
          }
LAB_0094f792:
          palVar63 = pvHMStore + iVar66;
          lVar19 = (*palVar63)[0];
          lVar20 = (*palVar63)[1];
          local_188 = (char)lVar19;
          cStack_187 = (char)((ulong)lVar19 >> 8);
          cStack_186 = (char)((ulong)lVar19 >> 0x10);
          cStack_185 = (char)((ulong)lVar19 >> 0x18);
          cStack_184 = (char)((ulong)lVar19 >> 0x20);
          cStack_183 = (char)((ulong)lVar19 >> 0x28);
          cStack_182 = (char)((ulong)lVar19 >> 0x30);
          cStack_181 = (char)((ulong)lVar19 >> 0x38);
          cStack_180 = (char)lVar20;
          cStack_17f = (char)((ulong)lVar20 >> 8);
          cStack_17e = (char)((ulong)lVar20 >> 0x10);
          cStack_17d = (char)((ulong)lVar20 >> 0x18);
          cStack_17c = (char)((ulong)lVar20 >> 0x20);
          cStack_17b = (char)((ulong)lVar20 >> 0x28);
          cStack_17a = (char)((ulong)lVar20 >> 0x30);
          cStack_179 = (char)((ulong)lVar20 >> 0x38);
          local_198 = (char)vMaxHM[1];
          cStack_197 = vMaxHM[1]._1_1_;
          cStack_196 = vMaxHM[1]._2_1_;
          cStack_195 = vMaxHM[1]._3_1_;
          cStack_194 = vMaxHM[1]._4_1_;
          cStack_193 = vMaxHM[1]._5_1_;
          cStack_192 = vMaxHM[1]._6_1_;
          cStack_191 = vMaxHM[1]._7_1_;
          cStack_190 = (char)vMaxHM[2];
          cStack_18f = vMaxHM[2]._1_1_;
          cStack_18e = vMaxHM[2]._2_1_;
          cStack_18d = vMaxHM[2]._3_1_;
          cStack_18c = vMaxHM[2]._4_1_;
          cStack_18b = vMaxHM[2]._5_1_;
          cStack_18a = vMaxHM[2]._6_1_;
          cStack_189 = vMaxHM[2]._7_1_;
          cVar68 = -(local_198 < local_188);
          cVar69 = -(cStack_197 < cStack_187);
          cVar73 = -(cStack_196 < cStack_186);
          cVar74 = -(cStack_195 < cStack_185);
          cVar76 = -(cStack_194 < cStack_184);
          cVar77 = -(cStack_193 < cStack_183);
          cVar79 = -(cStack_192 < cStack_182);
          cVar80 = -(cStack_191 < cStack_181);
          cVar82 = -(cStack_190 < cStack_180);
          cVar83 = -(cStack_18f < cStack_17f);
          cVar85 = -(cStack_18e < cStack_17e);
          cVar86 = -(cStack_18d < cStack_17d);
          cVar88 = -(cStack_18c < cStack_17c);
          cVar89 = -(cStack_18b < cStack_17b);
          cVar91 = -(cStack_18a < cStack_17a);
          cVar92 = -(cStack_189 < cStack_179);
          auVar27[1] = cVar69;
          auVar27[0] = cVar68;
          auVar27[2] = cVar73;
          auVar27[3] = cVar74;
          auVar27[4] = cVar76;
          auVar27[5] = cVar77;
          auVar27[6] = cVar79;
          auVar27[7] = cVar80;
          auVar27[9] = cVar83;
          auVar27[8] = cVar82;
          auVar27[10] = cVar85;
          auVar27[0xb] = cVar86;
          auVar27[0xc] = cVar88;
          auVar27[0xd] = cVar89;
          auVar27[0xe] = cVar91;
          auVar27[0xf] = cVar92;
          register0x00001240 = pblendvb(stack0xfffffffffffff058,(undefined1  [16])*palVar63,auVar27)
          ;
          auVar26[1] = cVar69;
          auVar26[0] = cVar68;
          auVar26[2] = cVar73;
          auVar26[3] = cVar74;
          auVar26[4] = cVar76;
          auVar26[5] = cVar77;
          auVar26[6] = cVar79;
          auVar26[7] = cVar80;
          auVar26[9] = cVar83;
          auVar26[8] = cVar82;
          auVar26[10] = cVar85;
          auVar26[0xb] = cVar86;
          auVar26[0xc] = cVar88;
          auVar26[0xd] = cVar89;
          auVar26[0xe] = cVar91;
          auVar26[0xf] = cVar92;
          register0x00001240 =
               pblendvb(stack0xfffffffffffff048,(undefined1  [16])pvHSStore[iVar66],auVar26);
          auVar25[1] = cVar69;
          auVar25[0] = cVar68;
          auVar25[2] = cVar73;
          auVar25[3] = cVar74;
          auVar25[4] = cVar76;
          auVar25[5] = cVar77;
          auVar25[6] = cVar79;
          auVar25[7] = cVar80;
          auVar25[9] = cVar83;
          auVar25[8] = cVar82;
          auVar25[10] = cVar85;
          auVar25[0xb] = cVar86;
          auVar25[0xc] = cVar88;
          auVar25[0xd] = cVar89;
          auVar25[0xe] = cVar91;
          auVar25[0xf] = cVar92;
          register0x00001240 =
               pblendvb(stack0xfffffffffffff038,(undefined1  [16])pvHLStore[iVar66],auVar25);
          auVar24[1] = cVar69;
          auVar24[0] = cVar68;
          auVar24[2] = cVar73;
          auVar24[3] = cVar74;
          auVar24[4] = cVar76;
          auVar24[5] = cVar77;
          auVar24[6] = cVar79;
          auVar24[7] = cVar80;
          auVar24[9] = cVar83;
          auVar24[8] = cVar82;
          auVar24[10] = cVar85;
          auVar24[0xb] = cVar86;
          auVar24[0xc] = cVar88;
          auVar24[0xd] = cVar89;
          auVar24[0xe] = cVar91;
          auVar24[0xf] = cVar92;
          register0x00001240 =
               pblendvb(stack0xfffffffffffff028,(undefined1  [16])pvE[iVar66],auVar24);
          uVar70 = CONCAT17(result._7_1_,
                            CONCAT16(result._6_1_,
                                     CONCAT15(result._5_1_,
                                              CONCAT14(result._4_1_,
                                                       CONCAT13(result._3_1_,
                                                                CONCAT12(result._2_1_,
                                                                         CONCAT11(result._1_1_,
                                                                                  (char)result))))))
                           );
          auVar21[8] = (char)vPosMask[0];
          auVar21._0_8_ = uVar70;
          auVar21[9] = vPosMask[0]._1_1_;
          auVar21[10] = vPosMask[0]._2_1_;
          auVar21[0xb] = vPosMask[0]._3_1_;
          auVar21[0xc] = vPosMask[0]._4_1_;
          auVar21[0xd] = vPosMask[0]._5_1_;
          auVar21[0xe] = vPosMask[0]._6_1_;
          auVar21[0xf] = vPosMask[0]._7_1_;
          uStack_50 = auVar21._8_8_;
          uStack_50 = uStack_50 &
                      CONCAT17(cVar92,CONCAT16(cVar91,CONCAT15(cVar89,CONCAT14(cVar88,CONCAT13(
                                                  cVar86,CONCAT12(cVar85,CONCAT11(cVar83,cVar82)))))
                                              ));
          auVar55._8_8_ = uStack_50;
          auVar55._0_8_ =
               uVar70 & CONCAT17(cVar80,CONCAT16(cVar79,CONCAT15(cVar77,CONCAT14(cVar76,CONCAT13(
                                                  cVar74,CONCAT12(cVar73,CONCAT11(cVar69,cVar68)))))
                                                ));
          if ((((((((((((((((auVar55 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar55 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar55 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar55 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar55 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar55 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (uStack_50 >> 7 & 1) != 0) || (uStack_50 >> 0xf & 1) != 0) ||
                  (uStack_50 >> 0x17 & 1) != 0) || (uStack_50 >> 0x1f & 1) != 0) ||
                (uStack_50 >> 0x27 & 1) != 0) || (uStack_50 >> 0x2f & 1) != 0) ||
              (uStack_50 >> 0x37 & 1) != 0) || (long)uStack_50 < 0) {
            matrix._0_4_ = s1Len;
          }
          pvE = pvHLLoad;
          pvHLLoad = palVar10;
          pvHLStore = pvHSLoad;
          pvHSLoad = palVar9;
          pvHSStore = pvHMLoad;
          pvHMLoad = palVar8;
          pvHMStore = pvHLoad;
          pvHLoad = palVar7;
        }
        local_f49 = cVar58;
        if (s2_end != 0) {
          for (end_query = 0; end_query < iVar61; end_query = end_query + 1) {
            vMaxH[0] = vMaxH[0] << 8 | (ulong)vMaxHM[1] >> 0x38;
            vMaxHM[1] = vMaxHM[1] << 8;
            vMaxHM[0] = vMaxHM[0] << 8 | (ulong)vMaxHS[1] >> 0x38;
            vMaxHS[1] = vMaxHS[1] << 8;
            vMaxHS[0] = vMaxHS[0] << 8 | (ulong)vMaxHL[1] >> 0x38;
            vMaxHL[1] = vMaxHL[1] << 8;
            vMaxHL[0] = vMaxHL[0] << 8 | (ulong)vPosMask[1] >> 0x38;
            vPosMask[1] = vPosMask[1] << 8;
          }
          local_f49 = vMaxH[0]._7_1_;
          local_f4a = vMaxHM[0]._7_1_;
          local_f4b = vMaxHS[0]._7_1_;
          local_f4c = vMaxHL[0]._7_1_;
        }
        matrix._4_4_ = iVar1 + -1;
        if (s1_end != 0) {
          m = (int8_t *)pvHLoad;
          s = (int8_t *)pvHMLoad;
          l = (int8_t *)pvHSLoad;
          _temp = pvHLLoad;
          for (k = 0; k < iVar60 * 0x10; k = k + 1) {
            iVar62 = k / 0x10 + (k % 0x10) * iVar60;
            if (iVar62 < iVar1) {
              if (local_f49 < *m) {
                local_f49 = *m;
                matrix._0_4_ = s2Len + -1;
                local_f4a = *s;
                local_f4b = *l;
                local_f4c = (char)(*_temp)[0];
                matrix._4_4_ = iVar62;
              }
              else if (((*m == local_f49) && ((int)matrix == s2Len + -1)) && (iVar62 < matrix._4_4_)
                      ) {
                local_f4a = *s;
                local_f4b = *l;
                local_f4c = (char)(*_temp)[0];
                matrix._4_4_ = iVar62;
              }
            }
            m = m + 1;
            s = s + 1;
            l = l + 1;
            _temp = (__m128i *)((long)*_temp + 1);
          }
        }
        if ((s1_end == 0) && (s2_end == 0)) {
          vH_1[0] = pvHLoad[iVar66][1];
          vHM_1[0] = pvHMLoad[iVar66][1];
          vHS_1[0] = pvHSLoad[iVar66][1];
          vHL_1[0] = pvHLLoad[iVar66][1];
          uStack_1258 = pvHLLoad[iVar66][0];
          vHL_1[1] = pvHSLoad[iVar66][0];
          vHS_1[1] = pvHMLoad[iVar66][0];
          vHM_1[1] = pvHLoad[iVar66][0];
          for (end_query = 0; end_query < iVar61; end_query = end_query + 1) {
            vH_1[0] = vH_1[0] << 8 | (ulong)vHM_1[1] >> 0x38;
            vHM_1[0] = vHM_1[0] << 8 | (ulong)vHS_1[1] >> 0x38;
            vHS_1[0] = vHS_1[0] << 8 | (ulong)vHL_1[1] >> 0x38;
            vHL_1[0] = vHL_1[0] << 8 | uStack_1258 >> 0x38;
            uStack_1258 = uStack_1258 << 8;
            vHL_1[1] = vHL_1[1] << 8;
            vHS_1[1] = vHS_1[1] << 8;
            vHM_1[1] = vHM_1[1] << 8;
          }
          matrix._0_4_ = s2Len + -1;
          matrix._4_4_ = iVar1 + -1;
          local_f49 = vH_1[0]._7_1_;
          local_f4a = vHM_1[0]._7_1_;
          local_f4b = vHS_1[0]._7_1_;
          local_f4c = vHL_1[0]._7_1_;
        }
        local_28 = (char)vSaturationCheckMax[1];
        cStack_27 = (char)((ulong)vSaturationCheckMax[1] >> 8);
        cStack_26 = (char)((ulong)vSaturationCheckMax[1] >> 0x10);
        cStack_25 = (char)((ulong)vSaturationCheckMax[1] >> 0x18);
        cStack_24 = (char)((ulong)vSaturationCheckMax[1] >> 0x20);
        cStack_23 = (char)((ulong)vSaturationCheckMax[1] >> 0x28);
        cStack_22 = (char)((ulong)vSaturationCheckMax[1] >> 0x30);
        cStack_21 = (char)((ulong)vSaturationCheckMax[1] >> 0x38);
        cStack_20 = (char)vSaturationCheckMin[0];
        cStack_1f = (char)((ulong)vSaturationCheckMin[0] >> 8);
        cStack_1e = (char)((ulong)vSaturationCheckMin[0] >> 0x10);
        cStack_1d = (char)((ulong)vSaturationCheckMin[0] >> 0x18);
        cStack_1c = (char)((ulong)vSaturationCheckMin[0] >> 0x20);
        cStack_1b = (char)((ulong)vSaturationCheckMin[0] >> 0x28);
        cStack_1a = (char)((ulong)vSaturationCheckMin[0] >> 0x30);
        cStack_19 = (char)((ulong)vSaturationCheckMin[0] >> 0x38);
        local_1a8 = (char)vMaxH[1];
        cStack_1a7 = (char)((ulong)vMaxH[1] >> 8);
        cStack_1a6 = (char)((ulong)vMaxH[1] >> 0x10);
        cStack_1a5 = (char)((ulong)vMaxH[1] >> 0x18);
        cStack_1a4 = (char)((ulong)vMaxH[1] >> 0x20);
        cStack_1a3 = (char)((ulong)vMaxH[1] >> 0x28);
        cStack_1a2 = (char)((ulong)vMaxH[1] >> 0x30);
        cStack_1a1 = (char)((ulong)vMaxH[1] >> 0x38);
        cStack_1a0 = (char)vSaturationCheckMax[0];
        cStack_19f = (char)((ulong)vSaturationCheckMax[0] >> 8);
        cStack_19e = (char)((ulong)vSaturationCheckMax[0] >> 0x10);
        cStack_19d = (char)((ulong)vSaturationCheckMax[0] >> 0x18);
        cStack_19c = (char)((ulong)vSaturationCheckMax[0] >> 0x20);
        cStack_19b = (char)((ulong)vSaturationCheckMax[0] >> 0x28);
        cStack_19a = (char)((ulong)vSaturationCheckMax[0] >> 0x30);
        cStack_199 = (char)((ulong)vSaturationCheckMax[0] >> 0x38);
        uVar70 = CONCAT17(-(cStack_19 < cVar58),
                          CONCAT16(-(cStack_1a < cVar58),
                                   CONCAT15(-(cStack_1b < cVar58),
                                            CONCAT14(-(cStack_1c < cVar58),
                                                     CONCAT13(-(cStack_1d < cVar58),
                                                              CONCAT12(-(cStack_1e < cVar58),
                                                                       CONCAT11(-(cStack_1f < cVar58
                                                                                 ),-(cStack_20 <
                                                                                    cVar58)))))))) |
                 CONCAT17(-(cVar59 < cStack_199),
                          CONCAT16(-(cVar59 < cStack_19a),
                                   CONCAT15(-(cVar59 < cStack_19b),
                                            CONCAT14(-(cVar59 < cStack_19c),
                                                     CONCAT13(-(cVar59 < cStack_19d),
                                                              CONCAT12(-(cVar59 < cStack_19e),
                                                                       CONCAT11(-(cVar59 < 
                                                  cStack_19f),-(cVar59 < cStack_1a0))))))));
        auVar54._8_8_ = uVar70;
        auVar54._0_8_ =
             CONCAT17(-(cStack_21 < cVar58),
                      CONCAT16(-(cStack_22 < cVar58),
                               CONCAT15(-(cStack_23 < cVar58),
                                        CONCAT14(-(cStack_24 < cVar58),
                                                 CONCAT13(-(cStack_25 < cVar58),
                                                          CONCAT12(-(cStack_26 < cVar58),
                                                                   CONCAT11(-(cStack_27 < cVar58),
                                                                            -(local_28 < cVar58)))))
                                       ))) |
             CONCAT17(-(cVar59 < cStack_1a1),
                      CONCAT16(-(cVar59 < cStack_1a2),
                               CONCAT15(-(cVar59 < cStack_1a3),
                                        CONCAT14(-(cVar59 < cStack_1a4),
                                                 CONCAT13(-(cVar59 < cStack_1a5),
                                                          CONCAT12(-(cVar59 < cStack_1a6),
                                                                   CONCAT11(-(cVar59 < cStack_1a7),
                                                                            -(cVar59 < local_1a8))))
                                                ))));
        if ((((((((((((((((auVar54 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar54 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar54 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar54 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar54 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar54 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar70 >> 7 & 1) != 0) || (uVar70 >> 0xf & 1) != 0) || (uVar70 >> 0x17 & 1) != 0)
               || (uVar70 >> 0x1f & 1) != 0) || (uVar70 >> 0x27 & 1) != 0) ||
             (uVar70 >> 0x2f & 1) != 0) || (uVar70 >> 0x37 & 1) != 0) || (long)uVar70 < 0) {
          *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40;
          local_f49 = '\0';
          local_f4a = '\0';
          local_f4b = '\0';
          local_f4c = '\0';
          matrix._4_4_ = 0;
          matrix._0_4_ = 0;
        }
        *(int *)&_segNum->s1 = (int)local_f49;
        *(int *)((long)&_segNum->s1 + 4) = matrix._4_4_;
        _segNum->s1Len = (int)matrix;
        *(int *)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->extra =
             (int)local_f4a;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->stats->similar =
             (int)local_f4b;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->stats->length =
             (int)local_f4c;
        parasail_free(ptr_00);
        parasail_free(b_01);
        parasail_free(b_00);
        parasail_free(b);
        parasail_free(ptr);
        parasail_free(pvE);
        parasail_free(pvHLLoad);
        parasail_free(pvHLStore);
        parasail_free(pvHSLoad);
        parasail_free(pvHSStore);
        parasail_free(pvHMLoad);
        parasail_free(pvHMStore);
        parasail_free(pvHLoad);
        profile_local = _segNum;
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int8_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int8_t score = 0;
    int8_t matches = 0;
    int8_t similar = 0;
    int8_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHM;
    __m128i vMaxHS;
    __m128i vMaxHL;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile8.score;
    vProfileM = (__m128i*)profile->profile8.matches;
    vProfileS = (__m128i*)profile->profile8.similar;
    vGapO = _mm_set1_epi8(open);
    vGapE = _mm_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi8(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHM = vNegLimit;
    vMaxHS = vNegLimit;
    vMaxHL = vNegLimit;
    vPosMask = _mm_cmpeq_epi8(_mm_set1_epi8(position),
            _mm_set_epi8(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int8_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_8_t h;
            __m128i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop. */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 1 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 1);
        vHM = _mm_slli_si128(vHM, 1);
        vHS = _mm_slli_si128(vHS, 1);
        vHL = _mm_slli_si128(vHL, 1);

        /* insert upper boundary condition */
        vH = _mm_insert_epi8(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_adds_epi8(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi8(vH_dag, vE);
            vH = _mm_max_epi8(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi8(vH, vH_dag);
            case2 = _mm_cmpeq_epi8(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_adds_epi8(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_adds_epi8(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_adds_epi8(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_subs_epi8(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_subs_epi8(vE, vGapE);
            vE = _mm_max_epi8(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi8(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_adds_epi8(vEL, vOne),
                    _mm_adds_epi8(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_subs_epi8(vF, vGapE);
            vF = _mm_max_epi8(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi8(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi8(vFL, vOne),
                    _mm_adds_epi8(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int8_t tmp2 = tmp < INT8_MIN ? INT8_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 1);
            vF = _mm_slli_si128(vF, 1);
            vFM = _mm_slli_si128(vFM, 1);
            vFS = _mm_slli_si128(vFS, 1);
            vFL = _mm_slli_si128(vFL, 1);
            vHp = _mm_insert_epi8(vHp, boundary[j], 0);
            vF = _mm_insert_epi8(vF, tmp2, 0);
            vFL = _mm_insert_epi8(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_adds_epi8(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi8(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi8(vH, vHp);
                case2 = _mm_cmpeq_epi8(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi8(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_subs_epi8(vH, vGapO);
                vF_ext = _mm_subs_epi8(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi8(vF_ext, vEF_opn),
                                _mm_cmpeq_epi8(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi8(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi8(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_adds_epi8(vFL, vOne),
                        _mm_adds_epi8(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

        /* extract vector containing last value from the column */
        {
            __m128i cond_max;
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            cond_max = _mm_cmpgt_epi8(vH, vMaxH);
            vMaxH = _mm_blendv_epi8(vMaxH, vH, cond_max);
            vMaxHM = _mm_blendv_epi8(vMaxHM, vHM, cond_max);
            vMaxHS = _mm_blendv_epi8(vMaxHS, vHS, cond_max);
            vMaxHL = _mm_blendv_epi8(vMaxHL, vHL, cond_max);
            if (_mm_movemask_epi8(_mm_and_si128(vPosMask, cond_max))) {
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 1);
            vHM = _mm_slli_si128(vHM, 1);
            vHS = _mm_slli_si128(vHS, 1);
            vHL = _mm_slli_si128(vHL, 1);
        }
        result->stats->rowcols->score_row[j] = (int8_t) _mm_extract_epi8 (vH, 15);
        result->stats->rowcols->matches_row[j] = (int8_t) _mm_extract_epi8 (vHM, 15);
        result->stats->rowcols->similar_row[j] = (int8_t) _mm_extract_epi8 (vHS, 15);
        result->stats->rowcols->length_row[j] = (int8_t) _mm_extract_epi8 (vHL, 15);
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the column maximums */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 1);
            vMaxHM = _mm_slli_si128(vMaxHM, 1);
            vMaxHS = _mm_slli_si128(vMaxHS, 1);
            vMaxHL = _mm_slli_si128(vMaxHL, 1);
        }
        end_query = s1Len-1;
        score = (int8_t) _mm_extract_epi8(vMaxH, 15);
        matches = (int8_t) _mm_extract_epi8(vMaxHM, 15);
        similar = (int8_t) _mm_extract_epi8(vMaxHS, 15);
        length = (int8_t) _mm_extract_epi8(vMaxHL, 15);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int8_t *t = (int8_t*)pvHStore;
        int8_t *m = (int8_t*)pvHMStore;
        int8_t *s = (int8_t*)pvHSStore;
        int8_t *l = (int8_t*)pvHLStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 1);
            vHM = _mm_slli_si128(vHM, 1);
            vHS = _mm_slli_si128(vHS, 1);
            vHL = _mm_slli_si128(vHL, 1);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int8_t) _mm_extract_epi8 (vH, 15);
        matches = (int8_t) _mm_extract_epi8 (vHM, 15);
        similar = (int8_t) _mm_extract_epi8 (vHS, 15);
        length = (int8_t) _mm_extract_epi8 (vHL, 15);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}